

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  uint *puVar1;
  undefined1 *puVar2;
  uint8_t *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint8_t uVar7;
  en_ptls_state_t eVar8;
  ptls_cipher_suite_t *ppVar9;
  st_ptls_update_esni_key_t *psVar10;
  code *pcVar11;
  st_ptls_hash_context_t *psVar12;
  _func_void_st_ptls_hash_context_t_ptr_void_ptr_size_t *p_Var13;
  _func_int_st_ptls_message_emitter_t_ptr *p_Var14;
  size_t len;
  _func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
  *p_Var15;
  st_ptls_traffic_protection_t *psVar16;
  ptls_verify_certificate_t *vc;
  undefined8 *puVar17;
  undefined8 uVar18;
  ptls_iovec_t pVar19;
  ptls_iovec_t ikm;
  ptls_message_emitter_t *ppVar20;
  undefined1 auVar21 [8];
  ptls_handshake_properties_t *ppVar22;
  ptls_message_emitter_t *ppVar23;
  ushort uVar24;
  int iVar25;
  int iVar26;
  st_ptls_client_hello_t *ch;
  uint8_t *puVar27;
  ptls_key_schedule_t *ppVar28;
  byte *pbVar29;
  ushort *puVar30;
  size_t sVar31;
  ptls_key_schedule_t *ppVar32;
  undefined1 *puVar33;
  void *pvVar34;
  size_t sVar35;
  ptls_buffer_t *ppVar36;
  byte bVar37;
  ulong uVar38;
  ulong uVar39;
  size_t *psVar40;
  long lVar41;
  st_ptls_client_hello_t *psVar42;
  _func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
  **pp_Var43;
  ulong uVar44;
  _func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_key_exchange_context_t_ptr_ptr *p_Var45;
  long lVar46;
  byte *pbVar47;
  ptls_key_schedule_t *ppVar48;
  ptls_key_schedule_t *ppVar49;
  ulong uVar50;
  ptls_key_schedule_t *ppVar51;
  ptls_context_t *ppVar52;
  ptls_key_exchange_algorithm_t *ppVar53;
  ptls_key_exchange_algorithm_t *slots;
  uint16_t *puVar54;
  uint uVar55;
  ptls_key_schedule_t *ppVar56;
  ptls_t *ppVar57;
  ptls_buffer_t *ppVar58;
  long lVar59;
  size_t sVar60;
  ptls_hash_context_t **pppVar61;
  uint8_t *puVar62;
  undefined8 *puVar63;
  bool bVar64;
  ptls_iovec_t pVar65;
  ptls_iovec_t ch_trunc;
  undefined8 uStack_6b0;
  ptls_key_schedule_t local_6a8 [8];
  undefined1 local_348 [416];
  ptls_raw_extension_t *local_1a8;
  size_t *local_1a0;
  undefined1 auStack_198 [8];
  ptls_iovec_t pubkey;
  ptls_key_schedule_t *local_180;
  size_t psk_index;
  ptls_cipher_suite_t *cs;
  uint8_t *local_168;
  ulong local_160;
  ptls_iovec_t *local_158;
  size_t local_150;
  st_ptls_signature_algorithms_t *local_148;
  size_t sStack_140;
  anon_struct_40_2_1fc0efb2_for_cert_compression_algos *local_138;
  size_t sStack_130;
  anon_struct_72_2_ef834970_for_client_ciphers *local_128;
  size_t sStack_120;
  anon_struct_16_2_f7306ffc_for_server_certificate_types *local_118;
  size_t sStack_110;
  byte local_108;
  ptls_key_schedule_t *ppStack_f8;
  anon_struct_24_2_cc7b932a key_share;
  undefined1 auStack_d8 [8];
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t server_name;
  int local_ac;
  ushort uStack_a8;
  undefined6 uStack_a6;
  int accept_early_data;
  ptls_buffer_t *local_a0;
  st_ptls_signature_algorithms_t *local_98;
  anon_struct_264_2_e44304f5_for_alpn *local_90;
  anon_struct_168_2_32182ca3_for_identities *local_88;
  ptls_key_schedule_t *local_80;
  ptls_key_schedule_t *local_78;
  size_t tbs_start;
  ptls_key_exchange_algorithm_t *local_68;
  ptls_handshake_properties_t *local_60;
  ptls_t *local_58;
  ptls_key_schedule_t *local_50;
  ptls_key_schedule_t *local_48;
  ptls_message_emitter_t *local_40;
  ptls_message_emitter_t *_emitter;
  
  uVar38 = message.len;
  puVar62 = message.base;
  ppVar48 = local_6a8;
  ppVar49 = local_6a8;
  ppStack_f8 = (ptls_key_schedule_t *)0x0;
  key_share.algorithm = (ptls_key_exchange_algorithm_t *)0x0;
  key_share.peer_key.base = (uint8_t *)0x0;
  local_180 = (ptls_key_schedule_t *)0xffffffffffffffff;
  auStack_198 = (undefined1  [8])0x0;
  pubkey.base = (uint8_t *)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  ecdh_secret.base = (uint8_t *)0x0;
  local_ac = 0;
  eVar8 = tls->state;
  uStack_6b0 = 0x1114bf;
  local_60 = properties;
  local_40 = emitter;
  _emitter = (ptls_message_emitter_t *)tls;
  ch = (st_ptls_client_hello_t *)malloc(0x500);
  ppVar32 = local_6a8;
  iVar26 = 0x201;
  if (ch == (st_ptls_client_hello_t *)0x0) goto LAB_00111535;
  uStack_6b0 = 0x1114e3;
  memset(local_6a8,0,0x500);
  uStack_6b0 = 0x1114fb;
  memcpy(local_348,&DAT_00128b48,0x198);
  uStack_6b0 = 0x11150b;
  memcpy(ch,local_6a8,0x500);
  if (5 < (long)uVar38) {
    uVar24 = *(ushort *)(puVar62 + 4) << 8 | *(ushort *)(puVar62 + 4) >> 8;
    ch->legacy_version = uVar24;
    ppVar32 = local_6a8;
    iVar26 = 0x46;
    if (uVar24 < 0x301) goto LAB_00111535;
    ppVar32 = (ptls_key_schedule_t *)(puVar62 + uVar38);
    if (((0x25 < uVar38) && (ch->random_bytes = puVar62 + 6, uVar38 != 0x26)) &&
       (uVar39 = (ulong)puVar62[0x26], uVar39 <= uVar38 - 0x27 && uVar39 < 0x21)) {
      (ch->legacy_session_id).base = puVar62 + 0x27;
      (ch->legacy_session_id).len = uVar39;
      if (1 < (ulong)((long)ppVar32 - (long)(puVar62 + uVar39 + 0x27))) {
        uVar24 = *(ushort *)(puVar62 + uVar39 + 0x27);
        puVar27 = puVar62 + uVar39 + 0x29;
        uVar44 = (ulong)(ushort)(uVar24 << 8 | uVar24 >> 8);
        if (uVar44 <= (ulong)((long)ppVar32 - (long)puVar27)) {
          (ch->cipher_suites).base = puVar27;
          ppVar28 = (ptls_key_schedule_t *)(puVar27 + uVar44);
          (ch->cipher_suites).len = uVar44;
          uVar50 = 0x208;
          do {
            if ((long)uVar44 < 2) goto LAB_00111511;
            lVar41 = uVar50 + uVar39;
            *(ushort *)((long)(ch->signature_algorithms).list + (uVar50 - 0x68)) =
                 *(ushort *)(puVar62 + lVar41 + -0x1df) << 8 |
                 *(ushort *)(puVar62 + lVar41 + -0x1df) >> 8;
            psVar40 = &(ch->client_ciphers).count;
            *psVar40 = *psVar40 + 1;
            if (0x245 < uVar50) break;
            uVar50 = uVar50 + 2;
            uVar44 = uVar44 - 2;
          } while ((ptls_key_schedule_t *)(puVar62 + lVar41 + -0x1dd) != ppVar28);
          if (ppVar28 != ppVar32) {
            uVar39 = (ulong)*(byte *)&ppVar28->generation;
            pbVar29 = (byte *)((long)&ppVar28->generation + 1);
            if (uVar39 <= (ulong)((long)ppVar32 - (long)pbVar29) && uVar39 != 0) {
              (ch->compression_methods).ids = pbVar29;
              pbVar29 = pbVar29 + uVar39;
              (ch->compression_methods).count = uVar39;
              ecdh_secret.len = 0;
              if (1 < (ulong)((long)ppVar32 - (long)pbVar29)) {
                ppVar28 = (ptls_key_schedule_t *)(pbVar29 + 2);
                psk_index = (size_t)ppVar28;
                uVar39 = (ulong)CONCAT11(*pbVar29,pbVar29[1]);
                if (uVar39 <= (ulong)((long)ppVar32 - (long)ppVar28)) {
                  local_80 = ppVar32;
                  ppVar56 = ppVar28;
                  if (uVar39 == 0) {
LAB_0011223a:
                    ppVar32 = local_6a8;
                    iVar26 = 0x32;
                    if (ppVar56 == local_80) {
                      lVar41 = 0;
                      do {
                        if (*(uint16_t *)((long)supported_versions + lVar41) == ch->selected_version
                           ) {
                          ppVar32 = local_6a8;
                          iVar26 = 0x46;
                          if ((((ch->legacy_version < 0x301) ||
                               (iVar26 = 0x2f, ppVar32 = local_6a8,
                               (ch->compression_methods).count != 1)) ||
                              (ppVar32 = local_6a8, *(ch->compression_methods).ids != '\0')) ||
                             ((ppVar9 = (ch->esni).cipher, ppVar9 != (ptls_cipher_suite_t *)0x0 &&
                              (ppVar32 = local_6a8, (ch->key_shares).base == (uint8_t *)0x0))))
                          goto LAB_00111535;
                          bVar37 = (ch->psk).field_0xb4;
                          if ((ch->psk).hash_end == (uint8_t *)0x0) {
                            ppVar32 = local_6a8;
                            if ((bVar37 & 1) != 0) goto LAB_00111535;
                          }
                          else {
                            ppVar32 = local_6a8;
                            if ((bVar37 & 2) == 0) goto LAB_00111535;
                          }
                          ppVar52 = (ptls_context_t *)_emitter->buf;
                          if ((ppVar52->field_0x70 & 1) != 0) {
                            puVar1 = &(ch->psk).ke_modes;
                            *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
                          }
                          if (eVar8 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
                            ppVar32 = local_6a8;
                            iVar26 = 0x32;
                            if ((bVar37 & 1) != 0) goto LAB_00111535;
                            uStack_6b0 = 0x1123b3;
                            iVar25 = (*ptls_mem_equal)(&_emitter[7].record_header_length,
                                                       ch->random_bytes,0x20);
                            iVar26 = 0x28;
                            ppVar32 = local_6a8;
                            if (iVar25 == 0) goto LAB_00111535;
                            local_48 = (ptls_key_schedule_t *)_emitter[6].begin_message;
                            if (local_48 == (ptls_key_schedule_t *)0x0) goto LAB_00112618;
                            uStack_6b0 = 0x1123e2;
                            sVar31 = strlen((char *)local_48);
                            ppVar32 = local_6a8;
                            if ((ch->server_name).len != sVar31) goto LAB_00111535;
                            uStack_6b0 = 0x112402;
                            iVar25 = bcmp((ch->server_name).base,local_48,sVar31);
                            ppVar32 = local_6a8;
                            if (iVar25 != 0) goto LAB_00111535;
                            goto LAB_00112618;
                          }
                          psVar40 = (size_t *)ch->random_bytes;
                          sVar60 = *psVar40;
                          p_Var14 = (_func_int_st_ptls_message_emitter_t_ptr *)psVar40[1];
                          ppVar36 = (ptls_buffer_t *)psVar40[3];
                          _emitter[7].commit_message =
                               (_func_int_st_ptls_message_emitter_t_ptr *)psVar40[2];
                          _emitter[8].buf = ppVar36;
                          _emitter[7].record_header_length = sVar60;
                          _emitter[7].begin_message = p_Var14;
                          if ((ch->legacy_session_id).len != 0) {
                            *(byte *)&_emitter[8].commit_message =
                                 *(byte *)&_emitter[8].commit_message | 4;
                          }
                          ecdh_secret.len = 0;
                          server_name.base = (uint8_t *)0x0;
                          if ((ppVar9 == (ptls_cipher_suite_t *)0x0) ||
                             (ppVar52->esni == (ptls_esni_context_t **)0x0)) {
                            local_48 = (ptls_key_schedule_t *)
                                       CONCAT44(local_48._4_4_,
                                                (int)CONCAT71((int7)((ulong)ppVar9 >> 8),1));
                            if ((ch->server_name).base != (uint8_t *)0x0) {
                              ecdh_secret.len = (size_t)(ch->server_name).base;
                              server_name.base = (uint8_t *)(ch->server_name).len;
                            }
                            local_50 = (ptls_key_schedule_t *)((ulong)local_50 & 0xffffffff00000000)
                            ;
                          }
                          else {
                            uStack_6b0 = 0x11246e;
                            psVar42 = ch;
                            iVar26 = client_hello_decrypt_esni
                                               (ppVar52,(ptls_iovec_t *)&ecdh_secret.len,
                                                (ptls_esni_secret_t **)&_emitter[8].enc,ch);
                            ppVar32 = local_6a8;
                            if (iVar26 != 0) goto LAB_00111535;
                            ppVar52 = (ptls_context_t *)_emitter->buf;
                            psVar10 = ppVar52->update_esni_key;
                            local_50 = (ptls_key_schedule_t *)
                                       CONCAT44(local_50._4_4_,
                                                (int)CONCAT71((int7)((ulong)psVar42 >> 8),1));
                            if (psVar10 != (st_ptls_update_esni_key_t *)0x0) {
                              uStack_6b0 = 0x1124b4;
                              iVar26 = (*psVar10->cb)(psVar10,(ptls_t *)_emitter,
                                                      *(ptls_iovec_t *)(_emitter[8].enc)->secret,
                                                      ((ch->esni).cipher)->hash,
                                                      (_emitter[8].enc)->secret + 0x20);
                              ppVar32 = local_6a8;
                              if (iVar26 != 0) goto LAB_00111535;
                              ppVar52 = (ptls_context_t *)_emitter->buf;
                            }
                            local_48 = (ptls_key_schedule_t *)((ulong)local_48 & 0xffffffff00000000)
                            ;
                          }
                          if (ppVar52->on_client_hello == (ptls_on_client_hello_t *)0x0) {
                            iVar26 = 0;
                          }
                          else {
                            psk_index = ecdh_secret.len;
                            cs = (ptls_cipher_suite_t *)server_name.base;
                            local_158 = (ch->alpn).list;
                            local_150 = (ch->alpn).count;
                            local_148 = &ch->signature_algorithms;
                            sStack_140 = (ch->signature_algorithms).count;
                            local_138 = &ch->cert_compression_algos;
                            sStack_130 = (ch->cert_compression_algos).count;
                            local_128 = &ch->client_ciphers;
                            sStack_120 = (ch->client_ciphers).count;
                            local_118 = &ch->server_certificate_types;
                            sStack_110 = (ch->server_certificate_types).count;
                            local_108 = (local_108 & 0xfc) + (char)local_50;
                            uStack_6b0 = 0x112597;
                            local_168 = puVar62;
                            local_160 = uVar38;
                            iVar26 = (*ppVar52->on_client_hello->cb)
                                               (ppVar52->on_client_hello,(ptls_t *)_emitter,
                                                (ptls_on_client_hello_parameters_t *)&psk_index);
                          }
                          if ((char)local_48 == '\0') {
                            uStack_6b0 = 0x1125b1;
                            free((void *)ecdh_secret.len);
                          }
                          ppVar32 = local_6a8;
                          if (iVar26 != 0) goto LAB_00111535;
                          uVar39 = (ch->server_certificate_types).count;
                          bVar37 = (byte)_emitter->buf[3].off >> 4 & 2;
                          if ((uVar39 == 0) && (bVar37 == 0)) goto LAB_00112618;
                          ppVar32 = local_6a8;
                          iVar26 = 0x2b;
                          if (uVar39 == 0) goto LAB_00111535;
                          if ((ch->server_certificate_types).list[0] == bVar37) goto LAB_00112618;
                          lVar41 = 0;
                          goto LAB_001125f7;
                        }
                        lVar41 = lVar41 + 2;
                      } while (lVar41 != 8);
                      if ((eVar8 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) &&
                         (puVar63 = *(undefined8 **)&_emitter->buf[1].is_allocated,
                         puVar63 != (undefined8 *)0x0)) {
                        psk_index = (size_t)(ch->server_name).base;
                        cs = (ptls_cipher_suite_t *)(ch->server_name).len;
                        local_158 = (ch->alpn).list;
                        local_150 = (ch->alpn).count;
                        local_148 = (st_ptls_signature_algorithms_t *)0x0;
                        sStack_140 = 0;
                        local_138 = (anon_struct_40_2_1fc0efb2_for_cert_compression_algos *)0x0;
                        sStack_130 = 0;
                        local_128 = (anon_struct_72_2_ef834970_for_client_ciphers *)0x0;
                        sStack_120 = 0;
                        local_118 = (anon_struct_16_2_f7306ffc_for_server_certificate_types *)0x0;
                        sStack_110 = 0;
                        local_108 = local_108 & 0xfc | 2;
                        uStack_6b0 = 0x1122dd;
                        local_168 = puVar62;
                        local_160 = uVar38;
                        iVar26 = (*(code *)*puVar63)(puVar63,_emitter);
                        ppVar32 = local_6a8;
                        if (iVar26 != 0) goto LAB_00111535;
                      }
                      ppVar32 = local_6a8;
                      iVar26 = 0x46;
                    }
                    goto LAB_00111535;
                  }
                  local_88 = &(ch->psk).identities;
                  local_98 = &ch->signature_algorithms;
                  local_90 = &ch->alpn;
                  local_a0 = (ptls_buffer_t *)&(ch->esni).key_share;
                  _uStack_a8 = &(ch->esni).peer_key;
                  tbs_start = (size_t)&ch->server_name;
                  local_1a8 = ch->unknown_extensions;
                  local_1a0 = &(ch->psk).identities.list[0].binder.len;
                  local_78 = (ptls_key_schedule_t *)(pbVar29 + uVar39 + 2);
LAB_00111749:
                  psk_index = (size_t)ppVar28;
                  if ((long)local_78 - (long)ppVar28 < 2) goto LAB_00111511;
                  bVar37 = *(byte *)&ppVar28->generation;
                  bVar4 = *(byte *)((long)&ppVar28->generation + 1);
                  uVar24 = CONCAT11(bVar37,bVar4);
                  if (uVar24 < 0x40) {
                    if ((*(byte *)((long)&ecdh_secret.len + (ulong)(uVar24 >> 3)) >> (uVar24 & 7) &
                        1) == 0) {
                      pbVar29 = (byte *)((long)&ecdh_secret.len + (ulong)(bVar4 >> 3));
                      *pbVar29 = *pbVar29 | '\x01' << (bVar4 & 7);
                      goto LAB_0011179f;
                    }
LAB_00112355:
                    ppVar32 = local_6a8;
                    iVar26 = 0x2f;
                    goto LAB_00111535;
                  }
LAB_0011179f:
                  if ((ulong)((long)local_78 - (long)((long)&ppVar28->generation + 2)) < 2)
                  goto LAB_00111511;
                  psk_index = (size_t)&ppVar28->field_0x4;
                  local_50 = ppVar28;
                  ppVar56 = (ptls_key_schedule_t *)
                            (ulong)CONCAT11(*(byte *)((long)&ppVar28->generation + 2),
                                            *(byte *)((long)&ppVar28->generation + 3));
                  if ((ptls_key_schedule_t *)((long)local_78 - psk_index) < ppVar56)
                  goto LAB_00111511;
                  puVar33 = &(ch->psk).field_0xb4;
                  *puVar33 = *puVar33 & 0xfd;
                  puVar63 = (undefined8 *)_emitter->buf[5].off;
                  ppVar57 = (ptls_t *)(ulong)CONCAT11(bVar37,bVar4);
                  ppVar53 = (ptls_key_exchange_algorithm_t *)psk_index;
                  if (puVar63 != (undefined8 *)0x0) {
                    uStack_6b0 = 0x11182e;
                    local_68 = (ptls_key_exchange_algorithm_t *)psk_index;
                    local_58 = ppVar57;
                    local_48 = ppVar56;
                    iVar25 = (*(code *)*puVar63)(puVar63,_emitter,1,ppVar57,psk_index,ppVar56);
                    ppVar32 = local_6a8;
                    ppVar53 = local_68;
                    ppVar56 = local_48;
                    ppVar57 = local_58;
                    iVar26 = 1;
                    if (iVar25 != 0) goto LAB_00111535;
                  }
                  ppVar28 = (ptls_key_schedule_t *)((long)&ppVar53->id + (long)ppVar56);
                  iVar26 = (int)ppVar57;
                  local_48 = ppVar28;
                  uVar55 = (uint)ppVar56;
                  if (0x1a < iVar26) {
                    switch(iVar26) {
                    case 0x29:
                      if (1 < uVar55) {
                        psk_index = (size_t)&local_50->field_0x6;
                        uVar39 = (ulong)CONCAT11(local_50->field_0x4,local_50->field_0x5);
                        if (uVar39 <= (long)ppVar28 - psk_index) {
                          pbVar29 = (byte *)(psk_index + uVar39);
                          lVar41 = 0;
                          do {
                            lVar59 = lVar41;
                            if ((long)pbVar29 - psk_index < 2) goto LAB_00111511;
                            pbVar47 = (byte *)(psk_index + 2);
                            uVar39 = (ulong)CONCAT11(*(byte *)psk_index,*(byte *)(psk_index + 1));
                            psk_index = (size_t)pbVar47;
                            if (((ulong)((long)pbVar29 - (long)pbVar47) < uVar39) ||
                               (psk_index = (size_t)(pbVar47 + uVar39),
                               (long)((long)pbVar29 - psk_index) < 4)) goto LAB_00111511;
                            bVar37 = *(byte *)psk_index;
                            bVar4 = *(byte *)(psk_index + 1);
                            bVar5 = *(byte *)(psk_index + 2);
                            bVar6 = *(byte *)(psk_index + 3);
                            psk_index = psk_index + 4;
                            uVar44 = (ch->psk).identities.count;
                            uVar50 = uVar44;
                            if (uVar44 < 4) {
                              uVar50 = uVar44 + 1;
                              (ch->psk).identities.count = uVar50;
                              local_88->list[uVar44].identity.base = pbVar47;
                              local_88->list[uVar44].identity.len = uVar39;
                              local_88->list[uVar44].obfuscated_ticket_age =
                                   (uint)bVar5 << 8 | (uint)bVar37 << 0x18 | (uint)bVar4 << 0x10 |
                                   (uint)bVar6;
                              puVar33 = &local_88->list[uVar44].field_0x14;
                              *(undefined8 *)puVar33 = 0;
                              *(undefined8 *)(puVar33 + 8) = 0;
                              *(undefined4 *)((long)&local_88->list[uVar44].binder.len + 4) = 0;
                            }
                            lVar41 = lVar59 + 1;
                          } while ((byte *)psk_index != pbVar29);
                          (ch->psk).hash_end = pbVar29;
                          if (1 < (ulong)((long)ppVar28 - (long)pbVar29)) {
                            psk_index = (size_t)(pbVar29 + 2);
                            uVar39 = (ulong)CONCAT11(*pbVar29,pbVar29[1]);
                            if ((uVar39 <= (long)ppVar28 - psk_index) && (uVar39 != 0)) {
                              ppVar56 = (ptls_key_schedule_t *)(psk_index + uVar39);
                              psk_index = (size_t)(pbVar29 + 3);
                              sVar60 = (size_t)pbVar29[2];
                              if (sVar60 <= (long)ppVar56 - psk_index) {
                                uVar39 = 0;
                                psVar40 = local_1a0;
                                while( true ) {
                                  if (uVar39 < uVar50) {
                                    ((ptls_iovec_t *)(psVar40 + -1))->base = (uint8_t *)psk_index;
                                    *psVar40 = sVar60;
                                  }
                                  ppVar32 = (ptls_key_schedule_t *)(psk_index + sVar60);
                                  if (ppVar32 == ppVar56) break;
                                  uVar39 = uVar39 + 1;
                                  psk_index = (long)&ppVar32->generation + 1;
                                  sVar60 = (size_t)*(byte *)&ppVar32->generation;
                                  lVar59 = lVar59 + -1;
                                  psVar40 = psVar40 + 5;
                                  if ((long)ppVar56 - psk_index < sVar60) goto LAB_00111511;
                                }
                                if (lVar59 != 0) goto LAB_00112355;
                                ppVar32 = local_6a8;
                                iVar26 = 0x32;
                                if (ppVar56 == ppVar28) {
                                  puVar33 = &(ch->psk).field_0xb4;
                                  *puVar33 = *puVar33 | 2;
                                  break;
                                }
                                goto LAB_00111535;
                              }
                            }
                          }
                        }
                      }
                      goto LAB_00111511;
                    case 0x2a:
                      puVar33 = &(ch->psk).field_0xb4;
                      *puVar33 = *puVar33 | 1;
                      break;
                    case 0x2b:
                      if (ppVar56 != (ptls_key_schedule_t *)0x0) {
                        psk_index = (size_t)&local_50->field_0x5;
                        bVar37 = local_50->field_0x4;
                        if (((ulong)bVar37 <= (long)ppVar28 - psk_index) && (1 < bVar37)) {
                          ppVar56 = (ptls_key_schedule_t *)(psk_index + bVar37);
                          ppVar32 = (ptls_key_schedule_t *)psk_index;
                          lVar41 = 4;
                          do {
                            ppVar51 = (ptls_key_schedule_t *)((long)&ppVar32->generation + 2);
                            if (lVar41 == 0) {
                              if (ppVar51 == ppVar56) {
                                lVar46 = 0;
                                goto LAB_001121cb;
                              }
                              lVar46 = 0;
                            }
                            else {
                              puVar54 = supported_versions;
                              lVar59 = 0;
                              do {
                                lVar46 = lVar59;
                                if (*puVar54 ==
                                    (uint16_t)
                                    (*(ushort *)&ppVar32->generation << 8 |
                                    *(ushort *)&ppVar32->generation >> 8)) break;
                                lVar59 = lVar59 + 1;
                                puVar54 = puVar54 + 1;
                                lVar46 = lVar41;
                              } while (lVar41 != lVar59);
                              if (ppVar51 == ppVar56) goto LAB_00112203;
                            }
                            ppVar32 = ppVar51;
                            lVar41 = lVar46;
                            if ((long)ppVar56 - (long)ppVar51 < 2) break;
                          } while( true );
                        }
                      }
                      goto LAB_00111511;
                    case 0x2c:
                      ppVar32 = local_6a8;
                      iVar26 = 0x2f;
                      if ((local_60 != (st_ptls_handshake_properties_t *)0x0) &&
                         (ppVar32 = local_6a8, (local_60->field_0).server.cookie.key != (void *)0x0)
                         ) {
                        (ch->cookie).all.base = (uint8_t *)ppVar53;
                        (ch->cookie).all.len = (size_t)ppVar56;
                        if ((ptls_key_schedule_t *)0x1 < ppVar56) {
                          puVar33 = &local_50->field_0x6;
                          uVar39 = (ulong)CONCAT11(local_50->field_0x4,local_50->field_0x5);
                          psk_index = (size_t)puVar33;
                          if ((uVar39 <= (ulong)((long)ppVar28 - (long)puVar33)) &&
                             ((ch->cookie).tbs.base = puVar33, 1 < uVar39)) {
                            ppVar32 = (ptls_key_schedule_t *)(puVar33 + uVar39);
                            psk_index = (size_t)&local_50->hkdf_label_prefix;
                            uVar39 = (ulong)CONCAT11(local_50->field_0x6,local_50->field_0x7);
                            if ((uVar39 <= (long)ppVar32 - psk_index) && (uVar39 != 0)) {
                              ppVar56 = (ptls_key_schedule_t *)(psk_index + uVar39);
                              uVar39 = (ulong)*(byte *)&local_50->hkdf_label_prefix;
                              puVar27 = (uint8_t *)((long)&local_50->hkdf_label_prefix + 1);
                              if (uVar39 <= (ulong)((long)ppVar56 - (long)puVar27)) {
                                (ch->cookie).ch1_hash.base = puVar27;
                                ppVar51 = (ptls_key_schedule_t *)(puVar27 + uVar39);
                                (ch->cookie).ch1_hash.len = uVar39;
                                if (ppVar51 != ppVar56) {
                                  psk_index = (long)&ppVar51->generation + 1;
                                  if (*(byte *)&ppVar51->generation == 1) {
                                    puVar2 = &(ch->cookie).field_0x40;
                                    *puVar2 = *puVar2 | 1;
                                  }
                                  else {
                                    if (*(byte *)&ppVar51->generation != 0) goto LAB_00111511;
                                    if (((ch->cookie).field_0x40 & 1) != 0) {
                                      uStack_6b0 = 0x113ef9;
                                      __assert_fail("!ch->cookie.sent_key_share",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                                  ,0xd47,
                                                  "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                                  );
                                    }
                                  }
                                  if (((ptls_key_schedule_t *)psk_index == ppVar56) &&
                                     ((ch->cookie).tbs.len = (long)ppVar56 - (long)puVar33,
                                     ppVar32 != ppVar56)) {
                                    psk_index = (long)&ppVar51->generation + 2;
                                    uVar39 = (ulong)*(byte *)&ppVar56->generation;
                                    if (uVar39 <= (long)ppVar32 - psk_index) {
                                      (ch->cookie).signature.base = (uint8_t *)psk_index;
                                      ppVar56 = (ptls_key_schedule_t *)(psk_index + uVar39);
                                      (ch->cookie).signature.len = uVar39;
                                      psk_index = (size_t)ppVar56;
                                      if (ppVar56 == ppVar32) goto joined_r0x00111d61;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        goto LAB_00111511;
                      }
                      goto LAB_00111535;
                    case 0x2d:
                      if (ppVar56 != (ptls_key_schedule_t *)0x0) {
                        psk_index = (size_t)&local_50->field_0x5;
                        uVar39 = (ulong)(byte)local_50->field_0x4;
                        if ((uVar39 <= (long)ppVar28 - psk_index) && (uVar39 != 0)) {
                          ppVar56 = (ptls_key_schedule_t *)((long)local_50->secret + (uVar39 - 0xb))
                          ;
                          ppVar32 = (ptls_key_schedule_t *)&local_50->field_0x6;
                          do {
                            psk_index = (size_t)ppVar32;
                            bVar37 = *(byte *)((long)&((ptls_key_schedule_t *)(psk_index + -0x68))->
                                                      hashes[0].ctx + 7);
                            if (bVar37 < 0x20) {
                              puVar1 = &(ch->psk).ke_modes;
                              *puVar1 = *puVar1 | 1 << (bVar37 & 0x1f);
                            }
                            uVar39 = uVar39 - 1;
                            ppVar32 = (ptls_key_schedule_t *)
                                      ((long)&((ptls_key_schedule_t *)psk_index)->generation + 1);
                          } while (uVar39 != 0);
                          goto joined_r0x00111d61;
                        }
                      }
                      goto LAB_00111511;
                    case 0x2e:
                    case 0x2f:
                    case 0x30:
                    case 0x31:
                    case 0x32:
switchD_001118a8_caseD_2e:
                      if ((local_60 != (st_ptls_handshake_properties_t *)0x0) &&
                         (local_60->collect_extension !=
                          (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0))
                      {
                        uStack_6b0 = 0x111cc2;
                        slots = ppVar53;
                        local_58 = ppVar57;
                        iVar26 = (*local_60->collect_extension)
                                           ((ptls_t *)_emitter,local_60,(uint16_t)ppVar57);
                        ppVar28 = local_48;
                        if (iVar26 != 0) {
                          uStack_6b0 = 0x111ce1;
                          iVar26 = collect_unknown_extension
                                             (local_58,(uint16_t)ppVar53,(uint8_t *)local_48,
                                              (uint8_t *)local_1a8,(ptls_raw_extension_t *)slots);
                          ppVar28 = local_48;
                          goto LAB_00111bda;
                        }
                      }
                      break;
                    case 0x33:
                      (ch->key_shares).base = (uint8_t *)ppVar53;
                      (ch->key_shares).len = (size_t)ppVar56;
                      break;
                    default:
                      if (iVar26 == 0x1b) {
                        if (ppVar56 != (ptls_key_schedule_t *)0x0) {
                          psk_index = (size_t)&local_50->field_0x5;
                          uVar39 = (ulong)(byte)local_50->field_0x4;
                          if (uVar39 <= (long)ppVar28 - psk_index) {
                            ppVar56 = (ptls_key_schedule_t *)(psk_index + uVar39);
                            do {
                              if ((long)uVar39 < 2) goto LAB_00111511;
                              bVar37 = *(byte *)&((ptls_key_schedule_t *)psk_index)->generation;
                              bVar4 = *(byte *)((long)&((ptls_key_schedule_t *)psk_index)->
                                                       generation + 1);
                              psk_index = (long)&((ptls_key_schedule_t *)psk_index)->generation + 2;
                              uVar44 = (ch->cert_compression_algos).count;
                              if (uVar44 < 0x10) {
                                (ch->cert_compression_algos).count = uVar44 + 1;
                                (ch->cert_compression_algos).list[uVar44] = CONCAT11(bVar37,bVar4);
                              }
                              uVar39 = uVar39 - 2;
                            } while ((ptls_key_schedule_t *)psk_index != ppVar56);
                            goto joined_r0x00111d61;
                          }
                        }
                        goto LAB_00111511;
                      }
                      if (iVar26 != 0xffce) goto switchD_001118a8_caseD_2e;
                      iVar25 = 0x2f;
                      ppVar32 = local_6a8;
                      iVar26 = iVar25;
                      if ((ch->esni).cipher != (ptls_cipher_suite_t *)0x0) goto LAB_00111535;
                      if (uVar55 < 2) goto LAB_00111511;
                      psk_index = (size_t)&local_50->field_0x6;
                      ppVar56 = *(ptls_key_schedule_t **)&_emitter->buf->is_allocated;
                      p_Var45 = *(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_key_exchange_context_t_ptr_ptr
                                  **)ppVar56;
                      ppVar32 = local_6a8;
                      if (p_Var45 ==
                          (_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_key_exchange_context_t_ptr_ptr
                           *)0x0) goto LAB_00111535;
                      while (*(ushort *)p_Var45 !=
                             (ushort)(*(ushort *)&local_50->field_0x4 << 8 |
                                     *(ushort *)&local_50->field_0x4 >> 8)) {
                        p_Var45 = (_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_key_exchange_context_t_ptr_ptr
                                   *)ppVar56->hkdf_label_prefix;
                        ppVar56 = (ptls_key_schedule_t *)&ppVar56->hkdf_label_prefix;
                        ppVar32 = local_6a8;
                        if (p_Var45 ==
                            (_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_key_exchange_context_t_ptr_ptr
                             *)0x0) goto LAB_00111535;
                      }
                      uStack_6b0 = 0x11206f;
                      local_50 = ppVar56;
                      iVar26 = select_key_share((ptls_key_exchange_algorithm_t **)local_a0,
                                                _uStack_a8,
                                                (ptls_key_exchange_algorithm_t **)_emitter->buf->off
                                                ,(uint8_t **)&psk_index,(uint8_t *)ppVar28,1);
                      ppVar32 = local_6a8;
                      if (iVar26 != 0) goto LAB_00111535;
                      if ((long)local_48 - psk_index < 2) goto LAB_00111511;
                      uVar39 = (ulong)(ushort)(*(ushort *)psk_index << 8 | *(ushort *)psk_index >> 8
                                              );
                      puVar27 = (uint8_t *)(psk_index + 2);
                      if ((ulong)((long)local_48 - (long)puVar27) < uVar39) goto LAB_00111511;
                      ppVar32 = local_6a8;
                      iVar26 = iVar25;
                      if (uVar39 != *(ulong *)(*(long *)(*(long *)local_50 + 0x10) + 8))
                      goto LAB_00111535;
                      puVar30 = (ushort *)(puVar27 + uVar39);
                      (ch->esni).record_digest = puVar27;
                      if ((ulong)((long)local_48 - (long)puVar30) < 2) goto LAB_00111511;
                      uVar39 = (ulong)(ushort)(*puVar30 << 8 | *puVar30 >> 8);
                      puVar30 = puVar30 + 1;
                      if ((ulong)((long)local_48 - (long)puVar30) < uVar39) goto LAB_00111511;
                      ppVar32 = local_6a8;
                      if (uVar39 < *(ulong *)(*(long *)(*(long *)local_50 + 8) + 0x38))
                      goto LAB_00111535;
                      (ch->esni).encrypted_sni.base = (uint8_t *)puVar30;
                      (ch->esni).encrypted_sni.len = uVar39;
                      ppVar32 = local_6a8;
                      iVar26 = 0x32;
                      if ((ptls_key_schedule_t *)((long)puVar30 + uVar39) != local_48)
                      goto LAB_00111535;
                      (ch->esni).cipher = *(ptls_cipher_suite_t **)local_50;
                      ppVar28 = local_48;
                    }
                    goto LAB_001121ed;
                  }
                  if (iVar26 < 0xd) {
                    if (iVar26 == 0) {
                      uStack_6b0 = 0x111b99;
                      iVar26 = client_hello_decode_server_name
                                         ((ptls_iovec_t *)tbs_start,(uint8_t **)&psk_index,
                                          (uint8_t *)ppVar28);
                      ppVar32 = local_6a8;
                      if ((iVar26 == 0) &&
                         (ppVar28 = local_48, ppVar32 = local_6a8, iVar26 = 0x32,
                         (ptls_key_schedule_t *)psk_index == local_48)) goto LAB_001121ed;
                      goto LAB_00111535;
                    }
                    if (iVar26 == 5) {
                      ch->field_0x4f8 = ch->field_0x4f8 | 1;
                    }
                    else {
                      if (iVar26 != 10) goto switchD_001118a8_caseD_2e;
                      (ch->negotiated_groups).base = (uint8_t *)ppVar53;
                      (ch->negotiated_groups).len = (size_t)ppVar56;
                    }
                    goto LAB_001121ed;
                  }
                  if (iVar26 == 0xd) {
                    uStack_6b0 = 0x111bd7;
                    iVar26 = decode_signature_algorithms
                                       (local_98,(uint8_t **)&psk_index,(uint8_t *)ppVar28);
LAB_00111bda:
                    ppVar32 = local_6a8;
                    if (iVar26 != 0) goto LAB_00111535;
                    goto LAB_001121ed;
                  }
                  if (iVar26 != 0x10) {
                    if (iVar26 != 0x14) goto switchD_001118a8_caseD_2e;
                    if (ppVar56 != (ptls_key_schedule_t *)0x0) {
                      psk_index = (size_t)&local_50->field_0x5;
                      bVar37 = local_50->field_0x4;
                      uVar39 = (ulong)bVar37;
                      if (uVar39 <= (long)ppVar28 - psk_index) {
                        if (uVar39 == 1) {
                          bVar37 = *(byte *)psk_index;
                        }
                        if (bVar37 != 0) {
                          ppVar56 = (ptls_key_schedule_t *)(psk_index + uVar39);
                          uVar44 = 0;
                          do {
                            uVar50 = (ch->server_certificate_types).count;
                            if (uVar50 < 8) {
                              uVar7 = *(uint8_t *)(psk_index + uVar44);
                              (ch->server_certificate_types).count = uVar50 + 1;
                              (ch->server_certificate_types).list[uVar50] = uVar7;
                            }
                            uVar44 = uVar44 + 1;
                          } while (uVar39 != uVar44);
                          goto joined_r0x00111d61;
                        }
                      }
                    }
                    goto LAB_00111511;
                  }
                  if (uVar55 < 2) goto LAB_00111511;
                  uVar39 = (ulong)(ushort)(*(ushort *)&local_50->field_0x4 << 8 |
                                          *(ushort *)&local_50->field_0x4 >> 8);
                  psk_index = (size_t)&local_50->field_0x6;
                  if ((long)ppVar28 - psk_index < uVar39) goto LAB_00111511;
                  ppVar56 = (ptls_key_schedule_t *)(psk_index + uVar39);
                  ppVar32 = (ptls_key_schedule_t *)psk_index;
                  do {
                    if (ppVar56 == ppVar32) goto LAB_00111511;
                    uVar39 = (ulong)*(byte *)&ppVar32->generation;
                    pbVar29 = (byte *)((long)&ppVar32->generation + 1);
                    if (((ulong)((long)ppVar56 - (long)pbVar29) < uVar39) || (uVar39 == 0))
                    goto LAB_00111511;
                    uVar44 = (ch->alpn).count;
                    if (uVar44 < 0x10) {
                      (ch->alpn).count = uVar44 + 1;
                      local_90->list[uVar44].base = pbVar29;
                      local_90->list[uVar44].len = uVar39;
                    }
                    ppVar32 = (ptls_key_schedule_t *)(pbVar29 + uVar39);
                  } while (ppVar32 != ppVar56);
                  goto joined_r0x00111d61;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00111511:
  ppVar32 = local_6a8;
  iVar26 = 0x32;
  goto LAB_00111535;
LAB_00112203:
  psk_index = (size_t)ppVar56;
  if (lVar46 != 4) {
LAB_001121cb:
    ch->selected_version = supported_versions[lVar46];
    psk_index = (size_t)ppVar56;
  }
joined_r0x00111d61:
  ppVar32 = local_6a8;
  iVar26 = 0x32;
  if (ppVar56 != ppVar28) goto LAB_00111535;
LAB_001121ed:
  psk_index = (size_t)ppVar28;
  ppVar56 = local_78;
  if (ppVar28 == local_78) goto LAB_0011223a;
  goto LAB_00111749;
  while (lVar41 = lVar59 + 1, (ch->server_certificate_types).list[lVar59 + 1] != bVar37) {
LAB_001125f7:
    lVar59 = lVar41;
    if (uVar39 - 1 == lVar59) break;
  }
  ppVar32 = local_6a8;
  if (uVar39 <= lVar59 + 1U) goto LAB_00111535;
LAB_00112618:
  puVar27 = (ch->cipher_suites).base;
  uStack_6b0 = 0x112646;
  iVar26 = select_cipher((ptls_cipher_suite_t **)&psk_index,
                         *(ptls_cipher_suite_t ***)&_emitter->buf->is_allocated,puVar27,
                         puVar27 + (ch->cipher_suites).len,(uint)_emitter->buf[3].off >> 6 & 1);
  ppVar20 = _emitter;
  ppVar32 = local_6a8;
  if (iVar26 != 0) goto LAB_00111535;
  if (eVar8 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    ppVar32 = local_6a8;
    iVar26 = 0x28;
    if (_emitter[7].enc != (st_ptls_traffic_protection_t *)psk_index) goto LAB_00111535;
  }
  else {
    _emitter[7].enc = (st_ptls_traffic_protection_t *)psk_index;
    uStack_6b0 = 0x112699;
    ppVar32 = key_schedule_new((ptls_cipher_suite_t *)psk_index,(ptls_cipher_suite_t **)0x0,
                               (char *)_emitter->buf[3].capacity);
    ppVar20[2].buf = (ptls_buffer_t *)ppVar32;
  }
  if ((ppStack_f8 == (ptls_key_schedule_t *)0x0) &&
     (local_48 = (ptls_key_schedule_t *)(ch->key_shares).base,
     local_48 != (ptls_key_schedule_t *)0x0)) {
    local_50 = (ptls_key_schedule_t *)(ch->key_shares).len;
    ppVar32 = local_6a8;
    iVar26 = 0x32;
    if (local_50 < (ptls_key_schedule_t *)0x2) goto LAB_00111535;
    puVar33 = (undefined1 *)
              (ulong)(ushort)(*(ushort *)&local_48->generation << 8 |
                             *(ushort *)&local_48->generation >> 8);
    psk_index = (long)&local_48->generation + 2;
    ppVar32 = local_6a8;
    if ((undefined1 *)((long)&local_50[-1].hashes[0].ctx + 6U) < puVar33) goto LAB_00111535;
    local_58 = (ptls_t *)((long)local_48->secret + (long)(puVar33 + -0xe));
    uStack_6b0 = 0x112dd4;
    iVar26 = select_key_share((ptls_key_exchange_algorithm_t **)&ppStack_f8,
                              (ptls_iovec_t *)&key_share,
                              (ptls_key_exchange_algorithm_t **)_emitter->buf->off,
                              (uint8_t **)&psk_index,(uint8_t *)local_58,0);
    ppVar32 = local_6a8;
    if (((iVar26 != 0) || (ppVar32 = local_6a8, iVar26 = 0x32, (ptls_t *)psk_index != local_58)) ||
       (ppVar32 = local_6a8, iVar26 = 0x32,
       psk_index != (long)local_48->secret + (long)local_50[-1].hashes)) goto LAB_00111535;
  }
  ppVar20 = _emitter;
  ppVar22 = local_60;
  ppVar32 = ppStack_f8;
  if (eVar8 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
LAB_001126b6:
    ppVar20 = _emitter;
    ppVar22 = local_60;
    ppVar48[-1].hashes[0].ctx = (ptls_hash_context_t *)0x1126ca;
    iVar26 = report_unknown_extensions((ptls_t *)ppVar20,ppVar22,ch->unknown_extensions);
    ppVar32 = ppVar48;
    ppVar49 = ppVar48;
    if (iVar26 != 0) goto LAB_00111535;
LAB_001126d2:
    local_58 = (ptls_t *)((ulong)local_58 & 0xffffffff00000000);
  }
  else {
    local_48 = ppStack_f8;
    if (ppStack_f8 != (ptls_key_schedule_t *)0x0 && (ch->cookie).all.len != 0) {
      sVar60 = *(size_t *)(*(long *)(**(long **)&_emitter->buf->is_allocated + 0x10) + 8);
      lVar41 = -(sVar60 + 0xf & 0xfffffffffffffff0);
      ppVar48 = (ptls_key_schedule_t *)((long)local_6a8 + lVar41);
      pVar65 = (ch->cookie).tbs;
      local_50 = ppVar48;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x11280a;
      iVar26 = calc_cookie_signature
                         ((ptls_t *)ppVar20,ppVar22,(ptls_key_exchange_algorithm_t *)ppVar32,pVar65,
                          (uint8_t *)ppVar48);
      ppVar49 = local_50;
      ppVar32 = ppVar48;
      if ((iVar26 != 0) || (iVar26 = 0x28, (ch->cookie).signature.len != sVar60)) goto LAB_00111535;
      puVar27 = (ch->cookie).signature.base;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x11283c;
      iVar25 = (*ptls_mem_equal)(puVar27,ppVar49,sVar60);
      ppVar20 = _emitter;
      if (iVar25 == 0) goto LAB_00111535;
      ppVar49 = (ptls_key_schedule_t *)_emitter[2].buf;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112851;
      key_schedule_update_ch1hash_prefix(ppVar49);
      local_50 = (ptls_key_schedule_t *)ppVar20[2].buf;
      if (local_50->num_hashes != 0) {
        local_58 = (ptls_t *)(ch->cookie).ch1_hash.base;
        local_68 = (ptls_key_exchange_algorithm_t *)(ch->cookie).ch1_hash.len;
        pppVar61 = &local_50->hashes[0].ctx;
        sVar60 = 0;
        do {
          ppVar57 = local_58;
          ppVar53 = local_68;
          psVar12 = *pppVar61;
          p_Var13 = psVar12->update;
          *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x11288e;
          (*p_Var13)(psVar12,ppVar57,(size_t)ppVar53);
          sVar60 = sVar60 + 1;
          pppVar61 = pppVar61 + 2;
        } while (sVar60 != local_50->num_hashes);
        local_50 = (ptls_key_schedule_t *)_emitter[2].buf;
      }
      ppVar49 = local_50;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x1128b8;
      key_schedule_extract(ppVar49,(ptls_iovec_t)ZEXT816(0));
      ppVar20 = local_40;
      local_50 = (ptls_key_schedule_t *)local_40->buf->off;
      p_Var14 = local_40->begin_message;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x1128ca;
      iVar26 = (*p_Var14)(ppVar20);
      if (iVar26 != 0) goto LAB_00111535;
      ppVar57 = (ptls_t *)local_40->buf;
      local_68 = (ptls_key_exchange_algorithm_t *)_emitter[2].buf;
      local_78 = (ptls_key_schedule_t *)(ppVar57->recvbuf).rec.base;
      local_58 = ppVar57;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x1128fb;
      iVar26 = ptls_buffer_reserve((ptls_buffer_t *)ppVar57,1);
      ppVar57 = local_58;
      if (iVar26 != 0) goto LAB_00111535;
      *(uint8_t *)((long)&local_58->ctx->random_bytes + (long)(local_58->recvbuf).rec.base) = '\x02'
      ;
      (local_58->recvbuf).rec.base = (local_58->recvbuf).rec.base + 1;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112920;
      iVar26 = ptls_buffer_reserve((ptls_buffer_t *)ppVar57,3);
      if (iVar26 != 0) goto LAB_00111535;
      ppVar52 = local_58->ctx;
      puVar27 = (local_58->recvbuf).rec.base;
      *(uint8_t *)((long)&ppVar52->random_bytes + (long)(puVar27 + 2)) = '\0';
      puVar27 = (uint8_t *)((long)&ppVar52->random_bytes + (long)puVar27);
      puVar27[0] = '\0';
      puVar27[1] = '\0';
      local_88 = (anon_struct_168_2_32182ca3_for_identities *)(local_58->recvbuf).rec.base;
      local_98 = (st_ptls_signature_algorithms_t *)((long)&local_88->list[0].identity.base + 3);
      (local_58->recvbuf).rec.base = (uint8_t *)local_98;
      ppVar36 = local_40->buf;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112969;
      iVar26 = ptls_buffer_reserve(ppVar36,2);
      if (iVar26 != 0) goto LAB_00111535;
      puVar27 = ppVar36->base;
      sVar60 = ppVar36->off;
      (puVar27 + sVar60)[0] = '\x03';
      (puVar27 + sVar60)[1] = '\x03';
      ppVar36->off = ppVar36->off + 2;
      ppVar36 = local_40->buf;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112994;
      iVar26 = ptls_buffer_reserve(ppVar36,0x20);
      if (iVar26 != 0) goto LAB_00111535;
      puVar27 = local_40->buf->base;
      sVar60 = local_40->buf->off;
      puVar3 = puVar27 + sVar60 + 0x10;
      puVar3[0] = 0xc2;
      puVar3[1] = 0xa2;
      puVar3[2] = '\x11';
      puVar3[3] = '\x16';
      puVar3[4] = 'z';
      puVar3[5] = 0xbb;
      puVar3[6] = 0x8c;
      puVar3[7] = '^';
      puVar3[8] = '\a';
      puVar3[9] = 0x9e;
      puVar3[10] = '\t';
      puVar3[0xb] = 0xe2;
      puVar3[0xc] = 200;
      puVar3[0xd] = 0xa8;
      puVar3[0xe] = '3';
      puVar3[0xf] = 0x9c;
      puVar27 = puVar27 + sVar60;
      puVar27[0] = 0xcf;
      puVar27[1] = '!';
      puVar27[2] = 0xad;
      puVar27[3] = 't';
      puVar27[4] = 0xe5;
      puVar27[5] = 0x9a;
      puVar27[6] = 'a';
      puVar27[7] = '\x11';
      puVar27[8] = 0xbe;
      puVar27[9] = '\x1d';
      puVar27[10] = 0x8c;
      puVar27[0xb] = '\x02';
      puVar27[0xc] = '\x1e';
      puVar27[0xd] = 'e';
      puVar27[0xe] = 0xb8;
      puVar27[0xf] = 0x91;
      ppVar36 = local_40->buf;
      ppVar36->off = ppVar36->off + 0x20;
      tbs_start = (size_t)ppVar36;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x1129d7;
      iVar26 = ptls_buffer_reserve(ppVar36,1);
      if (iVar26 != 0) goto LAB_00111535;
      *(undefined1 *)(*(long *)tbs_start + *(long *)(tbs_start + 0x10)) = 0;
      *(long *)(tbs_start + 0x10) = *(long *)(tbs_start + 0x10) + 1;
      ppVar36 = local_40->buf;
      tbs_start = ppVar36->off;
      puVar27 = (ch->legacy_session_id).base;
      sVar60 = (ch->legacy_session_id).len;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112a0e;
      iVar26 = ptls_buffer__do_pushv(ppVar36,puVar27,sVar60);
      if (iVar26 != 0) goto LAB_00111535;
      local_40->buf->base[tbs_start - 1] = (char)(int)local_40->buf->off - (char)tbs_start;
      local_90 = (anon_struct_264_2_e44304f5_for_alpn *)
                 CONCAT62(local_90._2_6_,*(undefined2 *)(_emitter[7].enc)->secret);
      ppVar36 = local_40->buf;
      tbs_start = (size_t)ppVar36;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112a53;
      iVar26 = ptls_buffer_reserve(ppVar36,2);
      if (iVar26 != 0) goto LAB_00111535;
      *(ushort *)(*(long *)tbs_start + *(long *)(tbs_start + 0x10)) =
           (ushort)local_90 << 8 | (ushort)local_90 >> 8;
      *(long *)(tbs_start + 0x10) = *(long *)(tbs_start + 0x10) + 2;
      ppVar36 = local_40->buf;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112a8e;
      iVar26 = ptls_buffer_reserve(ppVar36,1);
      if (iVar26 != 0) goto LAB_00111535;
      ppVar36->base[ppVar36->off] = '\0';
      ppVar36->off = ppVar36->off + 1;
      ppVar36 = local_40->buf;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112ab9;
      iVar26 = ptls_buffer_reserve(ppVar36,2);
      if (iVar26 != 0) goto LAB_00111535;
      puVar27 = ppVar36->base;
      sVar60 = ppVar36->off;
      (puVar27 + sVar60)[0] = '\0';
      (puVar27 + sVar60)[1] = '\0';
      ppVar36->off = ppVar36->off + 2;
      ppVar36 = local_40->buf;
      local_90 = (anon_struct_264_2_e44304f5_for_alpn *)ppVar36->off;
      tbs_start = (size_t)ppVar36;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112af3;
      iVar26 = ptls_buffer_reserve(ppVar36,2);
      if (iVar26 != 0) goto LAB_00111535;
      *(undefined2 *)(*(long *)tbs_start + *(long *)(tbs_start + 0x10)) = 0x2b00;
      *(long *)(tbs_start + 0x10) = *(long *)(tbs_start + 0x10) + 2;
      ppVar36 = local_40->buf;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112b25;
      iVar26 = ptls_buffer_reserve(ppVar36,2);
      if (iVar26 != 0) goto LAB_00111535;
      puVar27 = ppVar36->base;
      sVar60 = ppVar36->off;
      (puVar27 + sVar60)[0] = '\0';
      (puVar27 + sVar60)[1] = '\0';
      ppVar36->off = ppVar36->off + 2;
      ppVar36 = local_40->buf;
      tbs_start = ppVar36->off;
      _uStack_a8 = (ptls_iovec_t *)CONCAT62(uStack_a6,ch->selected_version);
      local_a0 = ppVar36;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112b6a;
      iVar26 = ptls_buffer_reserve(ppVar36,2);
      if (iVar26 != 0) goto LAB_00111535;
      *(ushort *)(local_a0->base + local_a0->off) = uStack_a8 << 8 | uStack_a8 >> 8;
      local_a0->off = local_a0->off + 2;
      lVar59 = local_40->buf->off - tbs_start;
      local_40->buf->base[tbs_start - 2] = (uint8_t)((ulong)lVar59 >> 8);
      local_40->buf->base[tbs_start - 1] = (uint8_t)lVar59;
      if (((ch->cookie).field_0x40 & 1) != 0) {
        ppVar36 = local_40->buf;
        *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x1141d4;
        iVar26 = ptls_buffer_reserve(ppVar36,2);
        if (iVar26 != 0) goto LAB_00111535;
        puVar27 = ppVar36->base;
        sVar60 = ppVar36->off;
        (puVar27 + sVar60)[0] = '\0';
        (puVar27 + sVar60)[1] = '3';
        ppVar36->off = ppVar36->off + 2;
        ppVar36 = local_40->buf;
        *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x114202;
        iVar26 = ptls_buffer_reserve(ppVar36,2);
        if (iVar26 != 0) goto LAB_00111535;
        puVar27 = ppVar36->base;
        sVar60 = ppVar36->off;
        (puVar27 + sVar60)[0] = '\0';
        (puVar27 + sVar60)[1] = '\0';
        ppVar36->off = ppVar36->off + 2;
        ppVar49 = (ptls_key_schedule_t *)local_40->buf;
        tbs_start = *(size_t *)ppVar49->secret;
        local_a0 = (ptls_buffer_t *)CONCAT62(local_a0._2_6_,*(undefined2 *)&local_48->generation);
        local_48 = ppVar49;
        *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x114247;
        iVar26 = ptls_buffer_reserve((ptls_buffer_t *)ppVar49,2);
        if (iVar26 != 0) goto LAB_00111535;
        *(ushort *)
         (*(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
            **)local_48->secret + *(long *)local_48) = (ushort)local_a0 << 8 | (ushort)local_a0 >> 8
        ;
        *(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
          **)local_48->secret =
             *(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
               **)local_48->secret + 2;
        lVar59 = local_40->buf->off - tbs_start;
        local_40->buf->base[tbs_start - 2] = (uint8_t)((ulong)lVar59 >> 8);
        local_40->buf->base[tbs_start - 1] = (uint8_t)lVar59;
      }
      ppVar36 = local_40->buf;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112bd8;
      iVar26 = ptls_buffer_reserve(ppVar36,2);
      if (iVar26 != 0) goto LAB_00111535;
      puVar27 = ppVar36->base;
      sVar60 = ppVar36->off;
      (puVar27 + sVar60)[0] = '\0';
      (puVar27 + sVar60)[1] = ',';
      ppVar36->off = ppVar36->off + 2;
      ppVar36 = local_40->buf;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112c06;
      iVar26 = ptls_buffer_reserve(ppVar36,2);
      if (iVar26 != 0) goto LAB_00111535;
      puVar27 = ppVar36->base;
      sVar60 = ppVar36->off;
      (puVar27 + sVar60)[0] = '\0';
      (puVar27 + sVar60)[1] = '\0';
      ppVar36->off = ppVar36->off + 2;
      ppVar36 = local_40->buf;
      local_48 = (ptls_key_schedule_t *)ppVar36->off;
      puVar27 = (ch->cookie).all.base;
      sVar60 = (ch->cookie).all.len;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112c42;
      iVar26 = ptls_buffer__do_pushv(ppVar36,puVar27,sVar60);
      if (iVar26 != 0) goto LAB_00111535;
      lVar59 = local_40->buf->off - (long)local_48;
      *(uint8_t *)((long)local_48->secret + (long)(local_40->buf->base + -0x12)) =
           (uint8_t)((ulong)lVar59 >> 8);
      *(uint8_t *)((long)local_48->secret + (long)(local_40->buf->base + -0x11)) = (uint8_t)lVar59;
      lVar59 = local_40->buf->off - (long)local_90;
      *(byte *)((long)&local_90->list[0].base + (long)(local_40->buf->base + -2)) =
           (byte)((ulong)lVar59 >> 8);
      *(byte *)((long)&local_90->list[0].base + (long)(local_40->buf->base + -1)) = (byte)lVar59;
      puVar27 = (local_58->recvbuf).rec.base;
      lVar59 = 0x10;
      do {
        *(byte *)((long)&local_88->list[0].identity.base + (long)local_58->ctx) =
             (byte)((ulong)((long)puVar27 - (long)local_98) >> ((byte)lVar59 & 0x3f));
        lVar59 = lVar59 + -8;
        local_88 = (anon_struct_168_2_32182ca3_for_identities *)
                   ((long)&local_88->list[0].identity.base + 1);
      } while (lVar59 != -8);
      if ((local_68 != (ptls_key_exchange_algorithm_t *)0x0) && (*(long *)(local_68 + 2) != 0)) {
        local_48 = (ptls_key_schedule_t *)
                   ((long)local_78->secret + (long)&local_58->ctx[-1].update_esni_key);
        local_58 = (ptls_t *)((local_58->recvbuf).rec.base + -(long)local_78);
        pp_Var43 = &local_68[2].exchange;
        lVar59 = 0;
        do {
          ppVar49 = local_48;
          ppVar57 = local_58;
          p_Var15 = *pp_Var43;
          pcVar11 = *(code **)p_Var15;
          *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112d12;
          (*pcVar11)(p_Var15,ppVar49,ppVar57);
          lVar59 = lVar59 + 1;
          pp_Var43 = pp_Var43 + 2;
        } while (lVar59 != *(long *)(local_68 + 2));
      }
      ppVar20 = local_40;
      p_Var14 = local_40->commit_message;
      *(undefined8 *)((long)local_6a8 + lVar41 + -8) = 0x112d2d;
      iVar26 = (*p_Var14)(ppVar20);
      if (iVar26 != 0) goto LAB_00111535;
      local_40->buf->off = (size_t)local_50;
      goto LAB_001126b6;
    }
    if ((ppStack_f8 == (ptls_key_schedule_t *)0x0) ||
       ((local_60 != (ptls_handshake_properties_t *)0x0 &&
        ((*(byte *)((long)&local_60->field_0 + 0x60) & 1) != 0)))) {
      puVar27 = (ch->negotiated_groups).base;
      if (puVar27 == (uint8_t *)0x0) {
        ppVar32 = local_6a8;
        iVar26 = 0x6d;
      }
      else {
        uStack_6b0 = 0x11335c;
        iVar26 = select_negotiated_group
                           ((ptls_key_exchange_algorithm_t **)&psk_index,
                            (ptls_key_exchange_algorithm_t **)_emitter->buf->off,puVar27,
                            puVar27 + (ch->negotiated_groups).len);
        ppVar32 = local_6a8;
        if (iVar26 == 0) {
          local_50 = (ptls_key_schedule_t *)_emitter[2].buf;
          if (local_50->num_hashes != 0) {
            pppVar61 = &local_50->hashes[0].ctx;
            sVar60 = 0;
            do {
              uStack_6b0 = 0x11338d;
              (*(*pppVar61)->update)(*pppVar61,puVar62,uVar38);
              sVar60 = sVar60 + 1;
              pppVar61 = pppVar61 + 2;
            } while (sVar60 != local_50->num_hashes);
            local_50 = (ptls_key_schedule_t *)_emitter[2].buf;
          }
          if (local_50->generation != 0) {
            uStack_6b0 = 0x1142d4;
            __assert_fail("tls->key_schedule->generation == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                          ,0xf33,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          if ((local_60 == (ptls_handshake_properties_t *)0x0) ||
             ((*(byte *)((long)&local_60->field_0 + 0x60) & 2) == 0)) {
            uStack_6b0 = 0x1133d5;
            key_schedule_transform_post_ch1hash(local_50);
            uStack_6b0 = 0x1133e6;
            key_schedule_extract((ptls_key_schedule_t *)_emitter[2].buf,(ptls_iovec_t)ZEXT816(0));
            uStack_6b0 = 0x1133ed;
            iVar26 = (*local_40->begin_message)(local_40);
            ppVar32 = local_6a8;
            if (iVar26 == 0) {
              ppVar36 = local_40->buf;
              local_60 = (ptls_handshake_properties_t *)_emitter[2].buf;
              sVar60 = ppVar36->off;
              uStack_6b0 = 0x113419;
              iVar26 = ptls_buffer_reserve(ppVar36,1);
              ppVar32 = local_6a8;
              if (iVar26 == 0) {
                ppVar36->base[ppVar36->off] = '\x02';
                ppVar36->off = ppVar36->off + 1;
                uStack_6b0 = 0x11343d;
                iVar26 = ptls_buffer_reserve(ppVar36,3);
                ppVar32 = local_6a8;
                if (iVar26 == 0) {
                  puVar62 = ppVar36->base;
                  sVar35 = ppVar36->off;
                  puVar62[sVar35 + 2] = '\0';
                  puVar62 = puVar62 + sVar35;
                  puVar62[0] = '\0';
                  puVar62[1] = '\0';
                  local_50 = (ptls_key_schedule_t *)ppVar36->off;
                  local_58 = (ptls_t *)((long)&local_50->generation + 3);
                  ppVar36->off = (size_t)local_58;
                  ppVar58 = local_40->buf;
                  uStack_6b0 = 0x11347f;
                  iVar26 = ptls_buffer_reserve(ppVar58,2);
                  ppVar32 = local_6a8;
                  if (iVar26 == 0) {
                    puVar62 = ppVar58->base;
                    sVar35 = ppVar58->off;
                    (puVar62 + sVar35)[0] = '\x03';
                    (puVar62 + sVar35)[1] = '\x03';
                    ppVar58->off = ppVar58->off + 2;
                    uStack_6b0 = 0x1134ab;
                    iVar26 = ptls_buffer_reserve(local_40->buf,0x20);
                    ppVar32 = local_6a8;
                    if (iVar26 == 0) {
                      puVar62 = local_40->buf->base;
                      sVar35 = local_40->buf->off;
                      puVar27 = puVar62 + sVar35 + 0x10;
                      puVar27[0] = 0xc2;
                      puVar27[1] = 0xa2;
                      puVar27[2] = '\x11';
                      puVar27[3] = '\x16';
                      puVar27[4] = 'z';
                      puVar27[5] = 0xbb;
                      puVar27[6] = 0x8c;
                      puVar27[7] = '^';
                      puVar27[8] = '\a';
                      puVar27[9] = 0x9e;
                      puVar27[10] = '\t';
                      puVar27[0xb] = 0xe2;
                      puVar27[0xc] = 200;
                      puVar27[0xd] = 0xa8;
                      puVar27[0xe] = '3';
                      puVar27[0xf] = 0x9c;
                      puVar62 = puVar62 + sVar35;
                      puVar62[0] = 0xcf;
                      puVar62[1] = '!';
                      puVar62[2] = 0xad;
                      puVar62[3] = 't';
                      puVar62[4] = 0xe5;
                      puVar62[5] = 0x9a;
                      puVar62[6] = 'a';
                      puVar62[7] = '\x11';
                      puVar62[8] = 0xbe;
                      puVar62[9] = '\x1d';
                      puVar62[10] = 0x8c;
                      puVar62[0xb] = '\x02';
                      puVar62[0xc] = '\x1e';
                      puVar62[0xd] = 'e';
                      puVar62[0xe] = 0xb8;
                      puVar62[0xf] = 0x91;
                      ppVar58 = local_40->buf;
                      ppVar58->off = ppVar58->off + 0x20;
                      uStack_6b0 = 0x1134ed;
                      iVar26 = ptls_buffer_reserve(ppVar58,1);
                      ppVar32 = local_6a8;
                      if (iVar26 == 0) {
                        ppVar58->base[ppVar58->off] = '\0';
                        ppVar58->off = ppVar58->off + 1;
                        sVar35 = local_40->buf->off;
                        uStack_6b0 = 0x11351d;
                        iVar26 = ptls_buffer__do_pushv
                                           (local_40->buf,(ch->legacy_session_id).base,
                                            (ch->legacy_session_id).len);
                        ppVar32 = local_6a8;
                        if (iVar26 == 0) {
                          local_40->buf->base[sVar35 - 1] =
                               (char)(int)local_40->buf->off - (char)sVar35;
                          local_68 = (ptls_key_exchange_algorithm_t *)
                                     CONCAT62(local_68._2_6_,
                                              *(undefined2 *)(_emitter[7].enc)->secret);
                          ppVar58 = local_40->buf;
                          uStack_6b0 = 0x11355c;
                          iVar26 = ptls_buffer_reserve(ppVar58,2);
                          ppVar32 = local_6a8;
                          if (iVar26 == 0) {
                            *(ushort *)(ppVar58->base + ppVar58->off) =
                                 (ushort)local_68 << 8 | (ushort)local_68 >> 8;
                            ppVar58->off = ppVar58->off + 2;
                            ppVar58 = local_40->buf;
                            uStack_6b0 = 0x113591;
                            iVar26 = ptls_buffer_reserve(ppVar58,1);
                            ppVar32 = local_6a8;
                            if (iVar26 == 0) {
                              ppVar58->base[ppVar58->off] = '\0';
                              ppVar58->off = ppVar58->off + 1;
                              ppVar58 = local_40->buf;
                              uStack_6b0 = 0x1135bd;
                              iVar26 = ptls_buffer_reserve(ppVar58,2);
                              ppVar32 = local_6a8;
                              if (iVar26 == 0) {
                                puVar62 = ppVar58->base;
                                sVar35 = ppVar58->off;
                                (puVar62 + sVar35)[0] = '\0';
                                (puVar62 + sVar35)[1] = '\0';
                                ppVar58->off = ppVar58->off + 2;
                                ppVar58 = local_40->buf;
                                local_68 = (ptls_key_exchange_algorithm_t *)ppVar58->off;
                                uStack_6b0 = 0x1135f4;
                                iVar26 = ptls_buffer_reserve(ppVar58,2);
                                ppVar32 = local_6a8;
                                if (iVar26 == 0) {
                                  puVar62 = ppVar58->base;
                                  sVar35 = ppVar58->off;
                                  (puVar62 + sVar35)[0] = '\0';
                                  (puVar62 + sVar35)[1] = '+';
                                  ppVar58->off = ppVar58->off + 2;
                                  ppVar58 = local_40->buf;
                                  uStack_6b0 = 0x113623;
                                  iVar26 = ptls_buffer_reserve(ppVar58,2);
                                  ppVar32 = local_6a8;
                                  if (iVar26 == 0) {
                                    puVar62 = ppVar58->base;
                                    sVar35 = ppVar58->off;
                                    (puVar62 + sVar35)[0] = '\0';
                                    (puVar62 + sVar35)[1] = '\0';
                                    ppVar58->off = ppVar58->off + 2;
                                    ppVar58 = local_40->buf;
                                    local_78 = (ptls_key_schedule_t *)ppVar58->off;
                                    local_80 = (ptls_key_schedule_t *)
                                               CONCAT62(local_80._2_6_,ch->selected_version);
                                    uStack_6b0 = 0x113662;
                                    iVar26 = ptls_buffer_reserve(ppVar58,2);
                                    ppVar32 = local_6a8;
                                    if (iVar26 == 0) {
                                      bVar64 = local_48 == (ptls_key_schedule_t *)0x0;
                                      *(ushort *)(ppVar58->base + ppVar58->off) =
                                           (ushort)local_80 << 8 | (ushort)local_80 >> 8;
                                      ppVar58->off = ppVar58->off + 2;
                                      lVar41 = local_40->buf->off - (long)local_78;
                                      *(uint8_t *)
                                       ((long)local_78->secret + (long)(local_40->buf->base + -0x12)
                                       ) = (uint8_t)((ulong)lVar41 >> 8);
                                      *(uint8_t *)
                                       ((long)local_78->secret + (long)(local_40->buf->base + -0x11)
                                       ) = (uint8_t)lVar41;
                                      local_48 = (ptls_key_schedule_t *)psk_index;
                                      if (psk_index != 0 && bVar64) {
                                        ppVar58 = local_40->buf;
                                        uStack_6b0 = 0x1142e8;
                                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                                        ppVar32 = local_6a8;
                                        if (iVar26 != 0) goto LAB_00111535;
                                        puVar62 = ppVar58->base;
                                        sVar35 = ppVar58->off;
                                        (puVar62 + sVar35)[0] = '\0';
                                        (puVar62 + sVar35)[1] = '3';
                                        ppVar58->off = ppVar58->off + 2;
                                        ppVar58 = local_40->buf;
                                        uStack_6b0 = 0x114317;
                                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                                        ppVar32 = local_6a8;
                                        if (iVar26 != 0) goto LAB_00111535;
                                        puVar62 = ppVar58->base;
                                        sVar35 = ppVar58->off;
                                        (puVar62 + sVar35)[0] = '\0';
                                        (puVar62 + sVar35)[1] = '\0';
                                        ppVar58->off = ppVar58->off + 2;
                                        ppVar58 = local_40->buf;
                                        local_78 = (ptls_key_schedule_t *)ppVar58->off;
                                        local_48 = (ptls_key_schedule_t *)
                                                   CONCAT62(local_48._2_6_,
                                                            *(undefined2 *)&local_48->generation);
                                        uStack_6b0 = 0x114359;
                                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                                        ppVar32 = local_6a8;
                                        if (iVar26 != 0) goto LAB_00111535;
                                        *(ushort *)(ppVar58->base + ppVar58->off) =
                                             (ushort)local_48 << 8 | (ushort)local_48 >> 8;
                                        ppVar58->off = ppVar58->off + 2;
                                        lVar41 = local_40->buf->off - (long)local_78;
                                        *(uint8_t *)
                                         ((long)local_78->secret +
                                         (long)(local_40->buf->base + -0x12)) =
                                             (uint8_t)((ulong)lVar41 >> 8);
                                        *(uint8_t *)
                                         ((long)local_78->secret +
                                         (long)(local_40->buf->base + -0x11)) = (uint8_t)lVar41;
                                      }
                                      lVar41 = local_40->buf->off - (long)local_68;
                                      (local_40->buf->base + -2)[(long)local_68] =
                                           (uint8_t)((ulong)lVar41 >> 8);
                                      (local_40->buf->base + -1)[(long)local_68] = (uint8_t)lVar41;
                                      sVar35 = ppVar36->off;
                                      lVar41 = 0x10;
                                      do {
                                        *(uint8_t *)
                                         ((long)local_50->secret + (long)(ppVar36->base + -0x10)) =
                                             (uint8_t)(sVar35 - (long)local_58 >>
                                                      ((byte)lVar41 & 0x3f));
                                        lVar41 = lVar41 + -8;
                                        local_50 = (ptls_key_schedule_t *)
                                                   ((long)&local_50->generation + 1);
                                      } while (lVar41 != -8);
                                      if ((local_60 != (ptls_handshake_properties_t *)0x0) &&
                                         ((local_60->field_0).server.cookie.additional_data.base !=
                                          (uint8_t *)0x0)) {
                                        puVar62 = ppVar36->base;
                                        sVar35 = ppVar36->off;
                                        puVar63 = (undefined8 *)((long)&local_60->field_0 + 0x60);
                                        puVar27 = (uint8_t *)0x0;
                                        do {
                                          uStack_6b0 = 0x11374d;
                                          (**(code **)*puVar63)
                                                    ((undefined8 *)*puVar63,puVar62 + sVar60,
                                                     sVar35 - sVar60);
                                          puVar27 = puVar27 + 1;
                                          puVar63 = puVar63 + 2;
                                        } while (puVar27 !=
                                                 (local_60->field_0).server.cookie.additional_data.
                                                 base);
                                      }
                                      uStack_6b0 = 0x113765;
                                      iVar26 = (*local_40->commit_message)(local_40);
                                      ppVar32 = local_6a8;
                                      if (iVar26 == 0) {
                                        uStack_6b0 = 0x11377a;
                                        iVar26 = push_change_cipher_spec
                                                           ((ptls_t *)_emitter,local_40);
                                        ppVar32 = local_6a8;
                                        if (iVar26 == 0) {
                                          *(undefined4 *)&_emitter->enc = 9;
                                          ppVar32 = local_6a8;
                                          iVar26 = 0x202;
                                          if (((ch->psk).field_0xb4 & 1) != 0) {
                                            *(undefined4 *)&_emitter[10].begin_message = 0;
                                            ppVar32 = local_6a8;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            uStack_6b0 = 0x113825;
            iVar26 = (*local_40->begin_message)(local_40);
            ppVar32 = local_6a8;
            if (iVar26 == 0) {
              ppVar36 = local_40->buf;
              uStack_6b0 = 0x113841;
              iVar26 = ptls_buffer_reserve(ppVar36,1);
              ppVar32 = local_6a8;
              if (iVar26 == 0) {
                ppVar36->base[ppVar36->off] = '\x02';
                ppVar36->off = ppVar36->off + 1;
                uStack_6b0 = 0x113865;
                iVar26 = ptls_buffer_reserve(ppVar36,3);
                ppVar32 = local_6a8;
                if (iVar26 == 0) {
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  puVar62[sVar60 + 2] = '\0';
                  puVar62 = puVar62 + sVar60;
                  puVar62[0] = '\0';
                  puVar62[1] = '\0';
                  local_50 = (ptls_key_schedule_t *)ppVar36->off;
                  pbVar29 = (byte *)((long)&local_50->generation + 3);
                  ppVar36->off = (size_t)pbVar29;
                  ppVar58 = local_40->buf;
                  uStack_6b0 = 0x1138a3;
                  iVar26 = ptls_buffer_reserve(ppVar58,2);
                  ppVar32 = local_6a8;
                  if (iVar26 == 0) {
                    puVar62 = ppVar58->base;
                    sVar60 = ppVar58->off;
                    (puVar62 + sVar60)[0] = '\x03';
                    (puVar62 + sVar60)[1] = '\x03';
                    ppVar58->off = ppVar58->off + 2;
                    uStack_6b0 = 0x1138cf;
                    iVar26 = ptls_buffer_reserve(local_40->buf,0x20);
                    ppVar32 = local_6a8;
                    if (iVar26 == 0) {
                      puVar62 = local_40->buf->base;
                      sVar60 = local_40->buf->off;
                      puVar27 = puVar62 + sVar60 + 0x10;
                      puVar27[0] = 0xc2;
                      puVar27[1] = 0xa2;
                      puVar27[2] = '\x11';
                      puVar27[3] = '\x16';
                      puVar27[4] = 'z';
                      puVar27[5] = 0xbb;
                      puVar27[6] = 0x8c;
                      puVar27[7] = '^';
                      puVar27[8] = '\a';
                      puVar27[9] = 0x9e;
                      puVar27[10] = '\t';
                      puVar27[0xb] = 0xe2;
                      puVar27[0xc] = 200;
                      puVar27[0xd] = 0xa8;
                      puVar27[0xe] = '3';
                      puVar27[0xf] = 0x9c;
                      puVar62 = puVar62 + sVar60;
                      puVar62[0] = 0xcf;
                      puVar62[1] = '!';
                      puVar62[2] = 0xad;
                      puVar62[3] = 't';
                      puVar62[4] = 0xe5;
                      puVar62[5] = 0x9a;
                      puVar62[6] = 'a';
                      puVar62[7] = '\x11';
                      puVar62[8] = 0xbe;
                      puVar62[9] = '\x1d';
                      puVar62[10] = 0x8c;
                      puVar62[0xb] = '\x02';
                      puVar62[0xc] = '\x1e';
                      puVar62[0xd] = 'e';
                      puVar62[0xe] = 0xb8;
                      puVar62[0xf] = 0x91;
                      ppVar58 = local_40->buf;
                      ppVar58->off = ppVar58->off + 0x20;
                      uStack_6b0 = 0x113911;
                      iVar26 = ptls_buffer_reserve(ppVar58,1);
                      ppVar32 = local_6a8;
                      if (iVar26 == 0) {
                        ppVar58->base[ppVar58->off] = '\0';
                        ppVar58->off = ppVar58->off + 1;
                        sVar60 = local_40->buf->off;
                        uStack_6b0 = 0x113941;
                        iVar26 = ptls_buffer__do_pushv
                                           (local_40->buf,(ch->legacy_session_id).base,
                                            (ch->legacy_session_id).len);
                        ppVar32 = local_6a8;
                        if (iVar26 == 0) {
                          local_40->buf->base[sVar60 - 1] =
                               (char)(int)local_40->buf->off - (char)sVar60;
                          local_58 = (ptls_t *)
                                     CONCAT62(local_58._2_6_,
                                              *(undefined2 *)(_emitter[7].enc)->secret);
                          ppVar58 = local_40->buf;
                          uStack_6b0 = 0x113980;
                          iVar26 = ptls_buffer_reserve(ppVar58,2);
                          ppVar32 = local_6a8;
                          if (iVar26 == 0) {
                            *(ushort *)(ppVar58->base + ppVar58->off) =
                                 (ushort)local_58 << 8 | (ushort)local_58 >> 8;
                            ppVar58->off = ppVar58->off + 2;
                            ppVar58 = local_40->buf;
                            uStack_6b0 = 0x1139b5;
                            iVar26 = ptls_buffer_reserve(ppVar58,1);
                            ppVar32 = local_6a8;
                            if (iVar26 == 0) {
                              ppVar58->base[ppVar58->off] = '\0';
                              ppVar58->off = ppVar58->off + 1;
                              ppVar58 = local_40->buf;
                              uStack_6b0 = 0x1139e1;
                              iVar26 = ptls_buffer_reserve(ppVar58,2);
                              ppVar32 = local_6a8;
                              if (iVar26 == 0) {
                                puVar62 = ppVar58->base;
                                sVar60 = ppVar58->off;
                                (puVar62 + sVar60)[0] = '\0';
                                (puVar62 + sVar60)[1] = '\0';
                                ppVar58->off = ppVar58->off + 2;
                                ppVar58 = local_40->buf;
                                local_58 = (ptls_t *)ppVar58->off;
                                uStack_6b0 = 0x113a18;
                                iVar26 = ptls_buffer_reserve(ppVar58,2);
                                ppVar32 = local_6a8;
                                if (iVar26 == 0) {
                                  puVar62 = ppVar58->base;
                                  sVar60 = ppVar58->off;
                                  (puVar62 + sVar60)[0] = '\0';
                                  (puVar62 + sVar60)[1] = '+';
                                  ppVar58->off = ppVar58->off + 2;
                                  ppVar58 = local_40->buf;
                                  uStack_6b0 = 0x113a47;
                                  iVar26 = ptls_buffer_reserve(ppVar58,2);
                                  ppVar32 = local_6a8;
                                  if (iVar26 == 0) {
                                    puVar62 = ppVar58->base;
                                    sVar60 = ppVar58->off;
                                    (puVar62 + sVar60)[0] = '\0';
                                    (puVar62 + sVar60)[1] = '\0';
                                    ppVar58->off = ppVar58->off + 2;
                                    ppVar58 = local_40->buf;
                                    local_68 = (ptls_key_exchange_algorithm_t *)ppVar58->off;
                                    local_78 = (ptls_key_schedule_t *)
                                               CONCAT62(local_78._2_6_,ch->selected_version);
                                    uStack_6b0 = 0x113a86;
                                    iVar26 = ptls_buffer_reserve(ppVar58,2);
                                    ppVar32 = local_6a8;
                                    if (iVar26 == 0) {
                                      *(ushort *)(ppVar58->base + ppVar58->off) =
                                           (ushort)local_78 << 8 | (ushort)local_78 >> 8;
                                      ppVar58->off = ppVar58->off + 2;
                                      lVar41 = local_40->buf->off - (long)local_68;
                                      (local_40->buf->base + -2)[(long)local_68] =
                                           (uint8_t)((ulong)lVar41 >> 8);
                                      (local_40->buf->base + -1)[(long)local_68] = (uint8_t)lVar41;
                                      local_68 = (ptls_key_exchange_algorithm_t *)psk_index;
                                      if (psk_index != 0 && local_48 == (ptls_key_schedule_t *)0x0)
                                      {
                                        ppVar58 = local_40->buf;
                                        uStack_6b0 = 0x113aff;
                                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                                        ppVar32 = local_6a8;
                                        if (iVar26 != 0) goto LAB_00111535;
                                        puVar62 = ppVar58->base;
                                        sVar60 = ppVar58->off;
                                        (puVar62 + sVar60)[0] = '\0';
                                        (puVar62 + sVar60)[1] = '3';
                                        ppVar58->off = ppVar58->off + 2;
                                        ppVar58 = local_40->buf;
                                        uStack_6b0 = 0x113b2e;
                                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                                        ppVar32 = local_6a8;
                                        if (iVar26 != 0) goto LAB_00111535;
                                        puVar62 = ppVar58->base;
                                        sVar60 = ppVar58->off;
                                        (puVar62 + sVar60)[0] = '\0';
                                        (puVar62 + sVar60)[1] = '\0';
                                        ppVar58->off = ppVar58->off + 2;
                                        ppVar58 = local_40->buf;
                                        local_78 = (ptls_key_schedule_t *)ppVar58->off;
                                        local_80 = (ptls_key_schedule_t *)
                                                   CONCAT62(local_80._2_6_,local_68->id);
                                        uStack_6b0 = 0x113b70;
                                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                                        ppVar32 = local_6a8;
                                        if (iVar26 != 0) goto LAB_00111535;
                                        *(ushort *)(ppVar58->base + ppVar58->off) =
                                             (ushort)local_80 << 8 | (ushort)local_80 >> 8;
                                        ppVar58->off = ppVar58->off + 2;
                                        lVar41 = local_40->buf->off - (long)local_78;
                                        *(uint8_t *)
                                         ((long)local_78->secret +
                                         (long)(local_40->buf->base + -0x12)) =
                                             (uint8_t)((ulong)lVar41 >> 8);
                                        *(uint8_t *)
                                         ((long)local_78->secret +
                                         (long)(local_40->buf->base + -0x11)) = (uint8_t)lVar41;
                                      }
                                      ppVar58 = local_40->buf;
                                      uStack_6b0 = 0x113bc8;
                                      iVar26 = ptls_buffer_reserve(ppVar58,2);
                                      ppVar32 = local_6a8;
                                      if (iVar26 == 0) {
                                        puVar62 = ppVar58->base;
                                        sVar60 = ppVar58->off;
                                        (puVar62 + sVar60)[0] = '\0';
                                        (puVar62 + sVar60)[1] = ',';
                                        ppVar58->off = ppVar58->off + 2;
                                        uStack_6b0 = 0x113bf0;
                                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                                        ppVar32 = local_6a8;
                                        if (iVar26 == 0) {
                                          puVar62 = ppVar58->base;
                                          sVar60 = ppVar58->off;
                                          (puVar62 + sVar60)[0] = '\0';
                                          (puVar62 + sVar60)[1] = '\0';
                                          local_80 = (ptls_key_schedule_t *)ppVar58->off;
                                          local_88 = (anon_struct_168_2_32182ca3_for_identities *)
                                                     ((long)&local_80->generation + 2);
                                          ppVar58->off = (size_t)local_88;
                                          uStack_6b0 = 0x113c27;
                                          iVar26 = ptls_buffer_reserve(ppVar58,2);
                                          ppVar32 = local_6a8;
                                          if (iVar26 == 0) {
                                            puVar62 = ppVar58->base;
                                            sVar60 = ppVar58->off;
                                            (puVar62 + sVar60)[0] = '\0';
                                            (puVar62 + sVar60)[1] = '\0';
                                            local_98 = (st_ptls_signature_algorithms_t *)
                                                       ppVar58->off;
                                            local_78 = (ptls_key_schedule_t *)(local_98->list + 1);
                                            ppVar58->off = (size_t)local_78;
                                            uStack_6b0 = 0x113c61;
                                            iVar26 = ptls_buffer_reserve(ppVar58,2);
                                            ppVar32 = local_6a8;
                                            if (iVar26 == 0) {
                                              puVar62 = ppVar58->base;
                                              sVar60 = ppVar58->off;
                                              (puVar62 + sVar60)[0] = '\0';
                                              (puVar62 + sVar60)[1] = '\0';
                                              tbs_start = ppVar58->off;
                                              local_90 = (anon_struct_264_2_e44304f5_for_alpn *)
                                                         (tbs_start + 2);
                                              ppVar58->off = (size_t)local_90;
                                              uStack_6b0 = 0x113c9b;
                                              iVar26 = ptls_buffer_reserve(ppVar58,1);
                                              ppVar32 = local_6a8;
                                              if (iVar26 == 0) {
                                                ppVar58->base[ppVar58->off] = '\0';
                                                local_a0 = (ptls_buffer_t *)(ppVar58->off + 1);
                                                ppVar58->off = (size_t)local_a0;
                                                _uStack_a8 = *(ptls_iovec_t **)
                                                              (*(long *)((_emitter[7].enc)->secret +
                                                                        0x10) + 8);
                                                uStack_6b0 = 0x113ce3;
                                                iVar26 = ptls_buffer_reserve(ppVar58,(size_t)
                                                  _uStack_a8);
                                                ppVar32 = local_6a8;
                                                if (iVar26 == 0) {
                                                  puVar62 = _emitter[2].buf[3].base;
                                                  uStack_6b0 = 0x113d07;
                                                  (**(code **)(puVar62 + 8))
                                                            (puVar62,ppVar58->base + ppVar58->off,1)
                                                  ;
                                                  puVar33 = (undefined1 *)
                                                            ((long)&_uStack_a8->base + ppVar58->off)
                                                  ;
                                                  ppVar58->off = (size_t)puVar33;
                                                  (ppVar58->base + -1)[(long)local_a0] =
                                                       (char)puVar33 - (char)local_a0;
                                                  uStack_6b0 = 0x113d34;
                                                  iVar26 = ptls_buffer_reserve(ppVar58,1);
                                                  ppVar32 = local_6a8;
                                                  if (iVar26 == 0) {
                                                    ppVar58->base[ppVar58->off] =
                                                         local_48 == (ptls_key_schedule_t *)0x0;
                                                    sVar60 = ppVar58->off + 1;
                                                    ppVar58->off = sVar60;
                                                    lVar41 = sVar60 - (long)local_90;
                                                    ppVar58->base[tbs_start] =
                                                         (uint8_t)((ulong)lVar41 >> 8);
                                                    ppVar58->base[tbs_start + 1] = (uint8_t)lVar41;
                                                    tbs_start = ppVar58->off;
                                                    uStack_6b0 = 0x113d87;
                                                    iVar26 = ptls_buffer_reserve(ppVar58,1);
                                                    ppVar32 = local_6a8;
                                                    if (iVar26 == 0) {
                                                      ppVar58->base[ppVar58->off] = '\0';
                                                      local_48 = (ptls_key_schedule_t *)
                                                                 (ppVar58->off + 1);
                                                      ppVar58->off = (size_t)local_48;
                                                      local_90 = *(
                                                  anon_struct_264_2_e44304f5_for_alpn **)
                                                  (*(long *)(**(long **)&_emitter->buf->is_allocated
                                                            + 0x10) + 8);
                                                  uStack_6b0 = 0x113dcf;
                                                  iVar26 = ptls_buffer_reserve(ppVar58,(size_t)
                                                  local_90);
                                                  ppVar32 = local_6a8;
                                                  if (iVar26 == 0) {
                                                    pVar65.len = tbs_start - (long)local_78;
                                                    uStack_6b0 = 0x113dff;
                                                    pVar65.base = (uint8_t *)
                                                                  ((long)local_78->secret +
                                                                  (long)(ppVar58->base + -0x10));
                                                    iVar26 = calc_cookie_signature
                                                                       ((ptls_t *)_emitter,local_60,
                                                                        local_68,pVar65,
                                                                        ppVar58->base + ppVar58->off
                                                                       );
                                                    ppVar32 = local_6a8;
                                                    if (iVar26 == 0) {
                                                      pbVar47 = (byte *)((long)&local_90->list[0].
                                                                                base + ppVar58->off)
                                                      ;
                                                      ppVar58->off = (size_t)pbVar47;
                                                      *(char *)((long)local_48->secret +
                                                               (long)(ppVar58->base + -0x11)) =
                                                           (char)pbVar47 - (char)local_48;
                                                      lVar41 = ppVar58->off - (long)local_78;
                                                      *(byte *)((long)local_98->list +
                                                               (long)ppVar58->base) =
                                                           (byte)((ulong)lVar41 >> 8);
                                                      *(byte *)((long)local_98->list +
                                                               (long)(ppVar58->base + 1)) =
                                                           (byte)lVar41;
                                                      lVar41 = ppVar58->off - (long)local_88;
                                                      *(uint8_t *)
                                                       ((long)local_80->secret +
                                                       (long)(ppVar58->base + -0x10)) =
                                                           (uint8_t)((ulong)lVar41 >> 8);
                                                      *(uint8_t *)
                                                       ((long)local_80->secret +
                                                       (long)(ppVar58->base + -0xf)) =
                                                           (uint8_t)lVar41;
                                                      lVar41 = local_40->buf->off - (long)local_58;
                                                      local_40->buf->base
                                                      [(long)(&(local_58->traffic_protection).dec +
                                                             -2) + 0x56] =
                                                           (uint8_t)((ulong)lVar41 >> 8);
                                                      local_40->buf->base
                                                      [(long)(&(local_58->traffic_protection).dec +
                                                             -2) + 0x57] = (uint8_t)lVar41;
                                                      sVar60 = ppVar36->off;
                                                      lVar41 = 0x10;
                                                      do {
                                                        *(uint8_t *)
                                                         ((long)local_50->secret +
                                                         (long)(ppVar36->base + -0x10)) =
                                                             (uint8_t)(sVar60 - (long)pbVar29 >>
                                                                      ((byte)lVar41 & 0x3f));
                                                        lVar41 = lVar41 + -8;
                                                        local_50 = (ptls_key_schedule_t *)
                                                                   ((long)&local_50->generation + 1)
                                                        ;
                                                      } while (lVar41 != -8);
                                                      uStack_6b0 = 0x113eb4;
                                                      iVar26 = (*local_40->commit_message)(local_40)
                                                      ;
                                                      ppVar32 = local_6a8;
                                                      if (iVar26 == 0) {
                                                        uStack_6b0 = 0x113ec9;
                                                        iVar25 = push_change_cipher_spec
                                                                           ((ptls_t *)_emitter,
                                                                            local_40);
                                                        ppVar32 = local_6a8;
                                                        iVar26 = 0x206;
                                                        if (iVar25 != 0) {
                                                          ppVar32 = local_6a8;
                                                          iVar26 = iVar25;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00111535;
    }
    uStack_6b0 = 0x112e46;
    iVar26 = report_unknown_extensions((ptls_t *)_emitter,local_60,ch->unknown_extensions);
    ppVar32 = local_6a8;
    if (iVar26 != 0) goto LAB_00111535;
    if (eVar8 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) goto LAB_001126d2;
    puVar27 = (ch->psk).hash_end;
    local_58 = (ptls_t *)CONCAT44(local_58._4_4_,1);
    ppVar49 = local_6a8;
    if ((((puVar27 != (uint8_t *)0x0) && (ppVar49 = local_6a8, ((ch->psk).ke_modes & 3) != 0)) &&
        (ppVar49 = local_6a8, *(long *)&_emitter->buf[3].is_allocated != 0)) &&
       (ppVar49 = local_6a8, (_emitter->buf[3].off & 8) == 0)) {
      ch_trunc.len = (long)puVar27 - (long)puVar62;
      uStack_6b0 = 0x112eb6;
      ch_trunc.base = puVar62;
      iVar26 = try_psk_handshake((ptls_t *)_emitter,(size_t *)&local_180,&local_ac,ch,ch_trunc);
      ppVar32 = local_6a8;
      ppVar49 = local_6a8;
      if (iVar26 != 0) goto LAB_00111535;
    }
  }
  local_50 = local_180;
  if ((local_180 == (ptls_key_schedule_t *)0xffffffffffffffff) || ((_emitter->buf[3].off & 8) != 0))
  {
    local_48 = (ptls_key_schedule_t *)_emitter[2].buf;
    if (((ptls_buffer_t *)((long)local_48 + 0x40))->off != 0) {
      ppVar36 = (ptls_buffer_t *)((long)local_48 + 0x60);
      sVar60 = 0;
      do {
        puVar27 = ppVar36->base;
        pcVar11 = *(code **)puVar27;
        *(undefined8 *)((long)ppVar49 + -8) = 0x112eec;
        (*pcVar11)(puVar27,puVar62,uVar38);
        sVar60 = sVar60 + 1;
        ppVar36 = (ptls_buffer_t *)&ppVar36->off;
      } while (sVar60 != ((ptls_buffer_t *)((long)local_48 + 0x40))->off);
    }
    if ((char)local_58 != '\0') {
      ppVar32 = (ptls_key_schedule_t *)_emitter[2].buf;
      if (ppVar32->generation != 0) {
        *(undefined8 *)((long)ppVar49 + -8) = 0x1141c0;
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0xf83,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      *(undefined8 *)((long)ppVar49 + -8) = 0x112f1d;
      key_schedule_extract(ppVar32,(ptls_iovec_t)ZEXT816(0));
    }
    local_48 = (ptls_key_schedule_t *)0x0;
    if (local_60 != (ptls_handshake_properties_t *)0x0) {
      sVar31 = 0;
      goto LAB_00112f2f;
    }
  }
  else {
    ppVar36 = _emitter[2].buf;
    if (ppVar36[2].off != 0) {
      puVar62 = (ch->psk).hash_end;
      local_80 = (ptls_key_schedule_t *)((long)local_80 - (long)puVar62);
      ppVar58 = ppVar36 + 3;
      sVar60 = 0;
      do {
        ppVar32 = local_80;
        puVar27 = ppVar58->base;
        pcVar11 = *(code **)puVar27;
        *(undefined8 *)((long)ppVar49 + -8) = 0x11272d;
        (*pcVar11)(puVar27,puVar62,ppVar32);
        sVar60 = sVar60 + 1;
        ppVar58 = (ptls_buffer_t *)&ppVar58->off;
      } while (sVar60 != ppVar36[2].off);
    }
    ppVar22 = local_60;
    uVar55 = (ch->psk).ke_modes;
    local_48 = (ptls_key_schedule_t *)0x1;
    if (((uVar55 & 1) == 0) && (local_48 = (ptls_key_schedule_t *)0x2, (uVar55 & 2) == 0)) {
      *(undefined8 *)((long)ppVar49 + -8) = 0x1142b5;
      __assert_fail("(ch->psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0xf8e,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    *(byte *)&_emitter[8].commit_message = *(byte *)&_emitter[8].commit_message | 2;
    if (local_60 != (ptls_handshake_properties_t *)0x0) {
      puVar62 = (ch->psk).identities.list[(long)local_50].binder.base;
      sVar31 = (ch->psk).identities.list[(long)local_50].binder.len;
      *(undefined8 *)((long)ppVar49 + -8) = 0x112798;
      memcpy(ppVar22,puVar62,sVar31);
LAB_00112f2f:
      *(size_t *)((long)&local_60->field_0 + 0x40) = sVar31;
    }
  }
  ppVar32 = ppVar49;
  if (((local_ac != 0) && (local_50 == (ptls_key_schedule_t *)0x0)) &&
     (*(int *)&_emitter->buf[2].field_0x1c != 0)) {
    *(undefined8 *)((long)ppVar49 + -8) = 0x112f5e;
    pvVar34 = malloc(0x40);
    ppVar20 = _emitter;
    _emitter[0xc].record_header_length = (size_t)pvVar34;
    iVar26 = 0x201;
    if (pvVar34 == (void *)0x0) goto LAB_00111535;
    *(undefined8 *)((long)ppVar49 + -8) = 0x112f86;
    iVar26 = derive_exporter_secret((ptls_t *)ppVar20,1);
    ppVar20 = _emitter;
    if (iVar26 != 0) goto LAB_00111535;
    *(undefined8 *)((long)ppVar49 + -8) = 0x112fa8;
    iVar26 = setup_traffic_protection((ptls_t *)ppVar20,0,"c e traffic",1,0);
    if (iVar26 != 0) goto LAB_00111535;
  }
  ppVar48 = ppStack_f8;
  if ((int)local_48 != 1) {
    if (ppStack_f8 == (ptls_key_schedule_t *)0x0) {
      iVar26 = 0x28;
      if ((ch->key_shares).base == (uint8_t *)0x0) {
        iVar26 = 0x6d;
      }
      goto LAB_00111535;
    }
    pVar19.len = (size_t)key_share.peer_key.base;
    pVar19.base = (uint8_t *)key_share.algorithm;
    p_Var15 = *(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                **)ppStack_f8->secret;
    *(undefined8 *)((long)ppVar49 + -8) = 0x1137e2;
    iVar26 = (*p_Var15)((st_ptls_key_exchange_algorithm_t *)ppVar48,(ptls_iovec_t *)auStack_198,
                        (ptls_iovec_t *)auStack_d8,pVar19);
    if (iVar26 != 0) goto LAB_00111535;
    _emitter[7].buf = (ptls_buffer_t *)ppVar48;
  }
  ppVar20 = local_40;
  p_Var14 = local_40->begin_message;
  *(undefined8 *)((long)ppVar49 + -8) = 0x112fc1;
  iVar26 = (*p_Var14)(ppVar20);
  if (iVar26 != 0) goto LAB_00111535;
  ppVar36 = local_40->buf;
  local_58 = (ptls_t *)_emitter[2].buf;
  sVar60 = ppVar36->off;
  *(undefined8 *)((long)ppVar49 + -8) = 0x112fed;
  iVar26 = ptls_buffer_reserve(ppVar36,1);
  if (iVar26 != 0) goto LAB_00111535;
  ppVar36->base[ppVar36->off] = '\x02';
  ppVar36->off = ppVar36->off + 1;
  *(undefined8 *)((long)ppVar49 + -8) = 0x113011;
  iVar26 = ptls_buffer_reserve(ppVar36,3);
  if (iVar26 != 0) goto LAB_00111535;
  puVar62 = ppVar36->base;
  sVar35 = ppVar36->off;
  puVar62[sVar35 + 2] = '\0';
  puVar62 = puVar62 + sVar35;
  puVar62[0] = '\0';
  puVar62[1] = '\0';
  local_68 = (ptls_key_exchange_algorithm_t *)ppVar36->off;
  local_78 = (ptls_key_schedule_t *)&local_68->field_0x3;
  ppVar36->off = (size_t)local_78;
  ppVar58 = local_40->buf;
  *(undefined8 *)((long)ppVar49 + -8) = 0x113053;
  iVar26 = ptls_buffer_reserve(ppVar58,2);
  if (iVar26 != 0) goto LAB_00111535;
  puVar62 = ppVar58->base;
  sVar35 = ppVar58->off;
  (puVar62 + sVar35)[0] = '\x03';
  (puVar62 + sVar35)[1] = '\x03';
  ppVar58->off = ppVar58->off + 2;
  ppVar58 = local_40->buf;
  *(undefined8 *)((long)ppVar49 + -8) = 0x11307f;
  iVar26 = ptls_buffer_reserve(ppVar58,0x20);
  ppVar20 = local_40;
  if (iVar26 != 0) goto LAB_00111535;
  puVar62 = local_40->buf->base;
  sVar35 = local_40->buf->off;
  pcVar11 = (code *)_emitter->buf->base;
  *(undefined8 *)((long)ppVar49 + -8) = 0x1130a4;
  (*pcVar11)(puVar62 + sVar35,0x20);
  ppVar58 = ppVar20->buf;
  ppVar58->off = ppVar58->off + 0x20;
  *(undefined8 *)((long)ppVar49 + -8) = 0x1130ba;
  iVar26 = ptls_buffer_reserve(ppVar58,1);
  if (iVar26 != 0) goto LAB_00111535;
  ppVar58->base[ppVar58->off] = '\0';
  ppVar58->off = ppVar58->off + 1;
  ppVar58 = local_40->buf;
  sVar35 = ppVar58->off;
  puVar62 = (ch->legacy_session_id).base;
  len = (ch->legacy_session_id).len;
  *(undefined8 *)((long)ppVar49 + -8) = 0x1130ea;
  iVar26 = ptls_buffer__do_pushv(ppVar58,puVar62,len);
  if (iVar26 != 0) goto LAB_00111535;
  local_40->buf->base[sVar35 - 1] = (char)(int)local_40->buf->off - (char)sVar35;
  local_80 = (ptls_key_schedule_t *)
             CONCAT62(local_80._2_6_,*(undefined2 *)(_emitter[7].enc)->secret);
  ppVar58 = local_40->buf;
  *(undefined8 *)((long)ppVar49 + -8) = 0x113129;
  iVar26 = ptls_buffer_reserve(ppVar58,2);
  if (iVar26 != 0) goto LAB_00111535;
  *(ushort *)(ppVar58->base + ppVar58->off) = (ushort)local_80 << 8 | (ushort)local_80 >> 8;
  ppVar58->off = ppVar58->off + 2;
  ppVar58 = local_40->buf;
  *(undefined8 *)((long)ppVar49 + -8) = 0x11315e;
  iVar26 = ptls_buffer_reserve(ppVar58,1);
  if (iVar26 != 0) goto LAB_00111535;
  ppVar58->base[ppVar58->off] = '\0';
  ppVar58->off = ppVar58->off + 1;
  ppVar58 = local_40->buf;
  *(undefined8 *)((long)ppVar49 + -8) = 0x11318a;
  iVar26 = ptls_buffer_reserve(ppVar58,2);
  if (iVar26 != 0) goto LAB_00111535;
  puVar62 = ppVar58->base;
  sVar35 = ppVar58->off;
  (puVar62 + sVar35)[0] = '\0';
  (puVar62 + sVar35)[1] = '\0';
  ppVar58->off = ppVar58->off + 2;
  ppVar58 = local_40->buf;
  local_80 = (ptls_key_schedule_t *)ppVar58->off;
  *(undefined8 *)((long)ppVar49 + -8) = 0x1131c1;
  iVar26 = ptls_buffer_reserve(ppVar58,2);
  if (iVar26 != 0) goto LAB_00111535;
  puVar62 = ppVar58->base;
  sVar35 = ppVar58->off;
  (puVar62 + sVar35)[0] = '\0';
  (puVar62 + sVar35)[1] = '+';
  ppVar58->off = ppVar58->off + 2;
  ppVar58 = local_40->buf;
  *(undefined8 *)((long)ppVar49 + -8) = 0x1131f0;
  iVar26 = ptls_buffer_reserve(ppVar58,2);
  if (iVar26 != 0) goto LAB_00111535;
  puVar62 = ppVar58->base;
  sVar35 = ppVar58->off;
  (puVar62 + sVar35)[0] = '\0';
  (puVar62 + sVar35)[1] = '\0';
  ppVar58->off = ppVar58->off + 2;
  ppVar58 = local_40->buf;
  local_88 = (anon_struct_168_2_32182ca3_for_identities *)ppVar58->off;
  local_98 = (st_ptls_signature_algorithms_t *)CONCAT62(local_98._2_6_,ch->selected_version);
  *(undefined8 *)((long)ppVar49 + -8) = 0x113232;
  iVar26 = ptls_buffer_reserve(ppVar58,2);
  if (iVar26 != 0) goto LAB_00111535;
  *(ushort *)(ppVar58->base + ppVar58->off) = (ushort)local_98 << 8 | (ushort)local_98 >> 8;
  ppVar58->off = ppVar58->off + 2;
  lVar41 = local_40->buf->off - (long)local_88;
  *(byte *)((long)&local_88->list[0].identity.base + (long)(local_40->buf->base + -2)) =
       (byte)((ulong)lVar41 >> 8);
  *(byte *)((long)&local_88->list[0].identity.base + (long)(local_40->buf->base + -1)) =
       (byte)lVar41;
  ppVar58 = local_40->buf;
  if ((int)local_48 == 1) {
LAB_00113286:
    *(undefined8 *)((long)ppVar49 + -8) = 0x113293;
    iVar26 = ptls_buffer_reserve(ppVar58,2);
    if (iVar26 != 0) goto LAB_00111535;
    puVar62 = ppVar58->base;
    sVar35 = ppVar58->off;
    (puVar62 + sVar35)[0] = '\0';
    (puVar62 + sVar35)[1] = ')';
    ppVar58->off = ppVar58->off + 2;
    *(undefined8 *)((long)ppVar49 + -8) = 0x1132bb;
    iVar26 = ptls_buffer_reserve(ppVar58,2);
    if (iVar26 != 0) goto LAB_00111535;
    puVar62 = ppVar58->base;
    sVar35 = ppVar58->off;
    (puVar62 + sVar35)[0] = '\0';
    (puVar62 + sVar35)[1] = '\0';
    local_88 = (anon_struct_168_2_32182ca3_for_identities *)ppVar58->off;
    ppVar58->off = (size_t)((long)&local_88->list[0].identity.base + 2);
    *(undefined8 *)((long)ppVar49 + -8) = 0x1132ee;
    iVar26 = ptls_buffer_reserve(ppVar58,2);
    if (iVar26 != 0) goto LAB_00111535;
    *(ushort *)(ppVar58->base + ppVar58->off) = (ushort)local_50 << 8 | (ushort)local_50 >> 8;
    sVar35 = ppVar58->off;
    ppVar58->off = sVar35 + 2;
    lVar41 = sVar35 - (long)local_88;
    *(byte *)((long)&local_88->list[0].identity.base + (long)ppVar58->base) =
         (byte)((ulong)lVar41 >> 8);
    *(byte *)((long)&local_88->list[0].identity.base + (long)(ppVar58->base + 1)) = (byte)lVar41;
  }
  else {
    *(undefined8 *)((long)ppVar49 + -8) = 0x113f06;
    iVar26 = ptls_buffer_reserve(ppVar58,2);
    if (iVar26 != 0) goto LAB_00111535;
    puVar62 = ppVar58->base;
    sVar35 = ppVar58->off;
    (puVar62 + sVar35)[0] = '\0';
    (puVar62 + sVar35)[1] = '3';
    ppVar58->off = ppVar58->off + 2;
    *(undefined8 *)((long)ppVar49 + -8) = 0x113f2e;
    iVar26 = ptls_buffer_reserve(ppVar58,2);
    if (iVar26 != 0) goto LAB_00111535;
    puVar62 = ppVar58->base;
    sVar35 = ppVar58->off;
    (puVar62 + sVar35)[0] = '\0';
    (puVar62 + sVar35)[1] = '\0';
    local_98 = (st_ptls_signature_algorithms_t *)ppVar58->off;
    tbs_start = (size_t)(local_98->list + 1);
    ppVar58->off = tbs_start;
    local_88 = (anon_struct_168_2_32182ca3_for_identities *)
               CONCAT62(local_88._2_6_,(uint16_t)ppStack_f8->generation);
    *(undefined8 *)((long)ppVar49 + -8) = 0x113f76;
    iVar26 = ptls_buffer_reserve(ppVar58,2);
    if (iVar26 != 0) goto LAB_00111535;
    *(ushort *)(ppVar58->base + ppVar58->off) = (ushort)local_88 << 8 | (ushort)local_88 >> 8;
    ppVar58->off = ppVar58->off + 2;
    *(undefined8 *)((long)ppVar49 + -8) = 0x113fa4;
    iVar26 = ptls_buffer_reserve(ppVar58,2);
    puVar62 = pubkey.base;
    auVar21 = auStack_198;
    if (iVar26 != 0) goto LAB_00111535;
    puVar27 = ppVar58->base;
    sVar35 = ppVar58->off;
    (puVar27 + sVar35)[0] = '\0';
    (puVar27 + sVar35)[1] = '\0';
    local_88 = (anon_struct_168_2_32182ca3_for_identities *)ppVar58->off;
    local_90 = (anon_struct_264_2_e44304f5_for_alpn *)((long)&local_88->list[0].identity.base + 2);
    ppVar58->off = (size_t)local_90;
    *(undefined8 *)((long)ppVar49 + -8) = 0x113fe7;
    iVar26 = ptls_buffer__do_pushv(ppVar58,(void *)auVar21,(size_t)puVar62);
    if (iVar26 != 0) goto LAB_00111535;
    lVar41 = ppVar58->off - (long)local_90;
    *(byte *)((long)&local_88->list[0].identity.base + (long)ppVar58->base) =
         (byte)((ulong)lVar41 >> 8);
    *(byte *)((long)&local_88->list[0].identity.base + (long)(ppVar58->base + 1)) = (byte)lVar41;
    lVar41 = ppVar58->off - tbs_start;
    *(byte *)((long)local_98->list + (long)ppVar58->base) = (byte)((ulong)lVar41 >> 8);
    *(byte *)((long)local_98->list + (long)(ppVar58->base + 1)) = (byte)lVar41;
    if ((int)local_48 != 0) goto LAB_00113286;
  }
  lVar41 = local_40->buf->off - (long)local_80;
  *(uint8_t *)((long)local_80->secret + (long)(local_40->buf->base + -0x12)) =
       (uint8_t)((ulong)lVar41 >> 8);
  *(uint8_t *)((long)local_80->secret + (long)(local_40->buf->base + -0x11)) = (uint8_t)lVar41;
  sVar35 = ppVar36->off;
  lVar41 = 0x10;
  do {
    *(uint8_t *)((long)&local_68->id + (long)ppVar36->base) =
         (uint8_t)(sVar35 - (long)local_78 >> ((byte)lVar41 & 0x3f));
    lVar41 = lVar41 + -8;
    local_68 = (ptls_key_exchange_algorithm_t *)((long)&local_68->id + 1);
  } while (lVar41 != -8);
  if ((local_58 != (ptls_t *)0x0) && (local_58->key_schedule != (ptls_key_schedule_t *)0x0)) {
    puVar27 = ppVar36->base;
    sVar35 = ppVar36->off;
    puVar62 = (local_58->traffic_protection).dec.secret + 8;
    ppVar48 = (ptls_key_schedule_t *)0x0;
    do {
      puVar63 = *(undefined8 **)puVar62;
      pcVar11 = (code *)*puVar63;
      *(undefined8 *)((long)ppVar49 + -8) = 0x1140bb;
      (*pcVar11)(puVar63,puVar27 + sVar60,sVar35 - sVar60);
      ppVar48 = (ptls_key_schedule_t *)((long)&ppVar48->generation + 1);
      puVar62 = puVar62 + 0x10;
    } while (ppVar48 != local_58->key_schedule);
  }
  ppVar20 = local_40;
  p_Var14 = local_40->commit_message;
  *(undefined8 *)((long)ppVar49 + -8) = 0x1140d3;
  iVar26 = (*p_Var14)(ppVar20);
  ppVar23 = _emitter;
  ppVar20 = local_40;
  if (iVar26 == 0) {
    *(undefined8 *)((long)ppVar49 + -8) = 0x1140e8;
    iVar26 = push_change_cipher_spec((ptls_t *)ppVar23,ppVar20);
    if (iVar26 == 0) {
      ppVar48 = (ptls_key_schedule_t *)_emitter[2].buf;
      if (ppVar48->generation != 1) {
        *(undefined8 *)((long)ppVar49 + -8) = 0x1143c1;
        __assert_fail("tls->key_schedule->generation == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0xfc3,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      ikm.len = (size_t)ecdh_secret.base;
      ikm.base = (uint8_t *)auStack_d8;
      *(undefined8 *)((long)ppVar49 + -8) = 0x114114;
      key_schedule_extract(ppVar48,ikm);
      ppVar20 = _emitter;
      *(undefined8 *)((long)ppVar49 + -8) = 0x114131;
      iVar26 = setup_traffic_protection((ptls_t *)ppVar20,1,"s hs traffic",2,0);
      ppVar20 = _emitter;
      if (iVar26 == 0) {
        pvVar34 = (void *)_emitter[0xc].record_header_length;
        if (pvVar34 == (void *)0x0) {
          *(undefined8 *)((long)ppVar49 + -8) = 0x1143db;
          iVar26 = setup_traffic_protection((ptls_t *)ppVar20,0,"c hs traffic",2,0);
          if (iVar26 != 0) goto LAB_00111535;
          if (((ch->psk).field_0xb4 & 1) != 0) {
            *(undefined4 *)&_emitter[10].begin_message = 0;
          }
        }
        else {
          ppVar48 = (ptls_key_schedule_t *)_emitter[2].buf;
          *(undefined8 *)((long)ppVar49 + -8) = 0x114161;
          iVar26 = derive_secret(ppVar48,pvVar34,"c hs traffic");
          ppVar20 = _emitter;
          if (iVar26 != 0) goto LAB_00111535;
          puVar63 = *(undefined8 **)&_emitter->buf[4].is_allocated;
          if (puVar63 != (undefined8 *)0x0) {
            pcVar11 = (code *)*puVar63;
            *(undefined8 *)((long)ppVar49 + -8) = 0x114194;
            iVar26 = (*pcVar11)(puVar63,ppVar20,0,2);
            if (iVar26 != 0) goto LAB_00111535;
          }
        }
        ppVar20 = local_40;
        p_Var14 = local_40->begin_message;
        *(undefined8 *)((long)ppVar49 + -8) = 0x114401;
        iVar26 = (*p_Var14)(ppVar20);
        if (iVar26 == 0) {
          ppVar48 = (ptls_key_schedule_t *)local_40->buf;
          local_58 = (ptls_t *)_emitter[2].buf;
          local_78 = *(ptls_key_schedule_t **)ppVar48->secret;
          local_50 = ppVar48;
          *(undefined8 *)((long)ppVar49 + -8) = 0x114432;
          iVar26 = ptls_buffer_reserve((ptls_buffer_t *)ppVar48,1);
          ppVar48 = local_50;
          if (iVar26 == 0) {
            (*(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
               **)local_50->secret)[*(long *)local_50] =
                 (_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                  )0x8;
            *(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
              **)local_50->secret =
                 *(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                   **)local_50->secret + 1;
            *(undefined8 *)((long)ppVar49 + -8) = 0x114457;
            iVar26 = ptls_buffer_reserve((ptls_buffer_t *)ppVar48,3);
            if (iVar26 == 0) {
              lVar41 = *(long *)local_50;
              p_Var15 = *(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                          **)local_50->secret;
              p_Var15[lVar41 + 2] =
                   (_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                    )0x0;
              *(undefined2 *)(p_Var15 + lVar41) = 0;
              local_68 = *(ptls_key_exchange_algorithm_t **)local_50->secret;
              local_80 = (ptls_key_schedule_t *)&local_68->field_0x3;
              *(ptls_key_schedule_t **)local_50->secret = local_80;
              ppVar36 = local_40->buf;
              *(undefined8 *)((long)ppVar49 + -8) = 0x11449d;
              iVar26 = ptls_buffer_reserve(ppVar36,2);
              if (iVar26 == 0) {
                puVar62 = ppVar36->base;
                sVar60 = ppVar36->off;
                (puVar62 + sVar60)[0] = '\0';
                (puVar62 + sVar60)[1] = '\0';
                local_88 = (anon_struct_168_2_32182ca3_for_identities *)ppVar36->off;
                local_98 = (st_ptls_signature_algorithms_t *)
                           ((long)&local_88->list[0].identity.base + 2);
                ppVar36->off = (size_t)local_98;
                if (_emitter[8].enc == (st_ptls_traffic_protection_t *)0x0) {
                  if (_emitter[6].begin_message != (_func_int_st_ptls_message_emitter_t_ptr *)0x0) {
                    *(undefined8 *)((long)ppVar49 + -8) = 0x1145e7;
                    iVar26 = ptls_buffer_reserve(ppVar36,2);
                    if (iVar26 != 0) goto LAB_00111535;
                    puVar62 = ppVar36->base;
                    sVar60 = ppVar36->off;
                    (puVar62 + sVar60)[0] = '\0';
                    (puVar62 + sVar60)[1] = '\0';
                    ppVar36->off = ppVar36->off + 2;
                    *(undefined8 *)((long)ppVar49 + -8) = 0x11460f;
                    iVar26 = ptls_buffer_reserve(ppVar36,2);
                    if (iVar26 != 0) goto LAB_00111535;
                    puVar62 = ppVar36->base;
                    sVar60 = ppVar36->off;
                    (puVar62 + sVar60)[0] = '\0';
                    (puVar62 + sVar60)[1] = '\0';
                    sVar60 = ppVar36->off;
                    ppVar36->off = sVar60 + 2;
                    ppVar36->base[sVar60] = '\0';
                    ppVar36->base[sVar60 + 1] = '\0';
                  }
                }
                else {
                  *(undefined8 *)((long)ppVar49 + -8) = 0x1144e9;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = 0xff;
                  (puVar62 + sVar60)[1] = 0xce;
                  ppVar36->off = ppVar36->off + 2;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x114511;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = '\0';
                  (puVar62 + sVar60)[1] = '\0';
                  tbs_start = ppVar36->off;
                  local_90 = (anon_struct_264_2_e44304f5_for_alpn *)(tbs_start + 2);
                  ppVar36->off = (size_t)local_90;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x11454b;
                  iVar26 = ptls_buffer_reserve(ppVar36,1);
                  if (iVar26 != 0) goto LAB_00111535;
                  ppVar20 = _emitter + 8;
                  ppVar36->base[ppVar36->off] = '\0';
                  ppVar36->off = ppVar36->off + 1;
                  psVar16 = ppVar20->enc;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x11457e;
                  iVar26 = ptls_buffer_reserve(ppVar36,0x10);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  uVar18 = *(undefined8 *)(psVar16->secret + 0x18);
                  *(undefined8 *)(puVar62 + sVar60) = *(undefined8 *)(psVar16->secret + 0x10);
                  *(undefined8 *)(puVar62 + sVar60 + 8) = uVar18;
                  sVar60 = ppVar36->off + 0x10;
                  ppVar36->off = sVar60;
                  lVar41 = sVar60 - (long)local_90;
                  ppVar36->base[tbs_start] = (uint8_t)((ulong)lVar41 >> 8);
                  ppVar36->base[tbs_start + 1] = (uint8_t)lVar41;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x1145ca;
                  free_esni_secret((ptls_esni_secret_t **)&ppVar20->enc,1);
                }
                if ((_emitter->buf[3].off & 0x20) != 0) {
                  *(undefined8 *)((long)ppVar49 + -8) = 0x114660;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = '\0';
                  (puVar62 + sVar60)[1] = '\x14';
                  ppVar36->off = ppVar36->off + 2;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x114688;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = '\0';
                  (puVar62 + sVar60)[1] = '\0';
                  sVar60 = ppVar36->off;
                  ppVar36->off = sVar60 + 2;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x1146ba;
                  iVar26 = ptls_buffer_reserve(ppVar36,1);
                  if (iVar26 != 0) goto LAB_00111535;
                  ppVar36->base[ppVar36->off] = '\x02';
                  sVar35 = ppVar36->off + 1;
                  ppVar36->off = sVar35;
                  lVar41 = sVar35 - (sVar60 + 2);
                  ppVar36->base[sVar60] = (uint8_t)((ulong)lVar41 >> 8);
                  ppVar36->base[sVar60 + 1] = (uint8_t)lVar41;
                }
                if (_emitter[6].commit_message != (_func_int_st_ptls_message_emitter_t_ptr *)0x0) {
                  *(undefined8 *)((long)ppVar49 + -8) = 0x11470e;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = '\0';
                  (puVar62 + sVar60)[1] = '\x10';
                  ppVar36->off = ppVar36->off + 2;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x114736;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = '\0';
                  (puVar62 + sVar60)[1] = '\0';
                  tbs_start = ppVar36->off;
                  local_90 = (anon_struct_264_2_e44304f5_for_alpn *)(tbs_start + 2);
                  ppVar36->off = (size_t)local_90;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x114770;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = '\0';
                  (puVar62 + sVar60)[1] = '\0';
                  local_a0 = (ptls_buffer_t *)ppVar36->off;
                  _uStack_a8 = (ptls_iovec_t *)((long)&local_a0->base + 2);
                  ppVar36->off = (size_t)_uStack_a8;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x1147ad;
                  iVar26 = ptls_buffer_reserve(ppVar36,1);
                  if (iVar26 != 0) goto LAB_00111535;
                  ppVar36->base[ppVar36->off] = '\0';
                  sVar60 = ppVar36->off;
                  sVar35 = sVar60 + 1;
                  ppVar36->off = sVar35;
                  p_Var14 = _emitter[6].commit_message;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x1147df;
                  sVar31 = strlen((char *)p_Var14);
                  *(undefined8 *)((long)ppVar49 + -8) = 0x1147ed;
                  iVar26 = ptls_buffer__do_pushv(ppVar36,p_Var14,sVar31);
                  if (iVar26 != 0) goto LAB_00111535;
                  ppVar36->base[sVar60] = (char)(int)ppVar36->off - (char)sVar35;
                  lVar41 = ppVar36->off - (long)_uStack_a8;
                  *(uint8_t *)((long)&local_a0->base + (long)ppVar36->base) =
                       (uint8_t)((ulong)lVar41 >> 8);
                  *(uint8_t *)((long)&local_a0->base + (long)(ppVar36->base + 1)) = (uint8_t)lVar41;
                  lVar41 = ppVar36->off - (long)local_90;
                  ppVar36->base[tbs_start] = (uint8_t)((ulong)lVar41 >> 8);
                  ppVar36->base[tbs_start + 1] = (uint8_t)lVar41;
                }
                if (_emitter[0xc].record_header_length != 0) {
                  *(undefined8 *)((long)ppVar49 + -8) = 0x11485f;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = '\0';
                  (puVar62 + sVar60)[1] = '*';
                  ppVar36->off = ppVar36->off + 2;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x114887;
                  iVar26 = ptls_buffer_reserve(ppVar36,2);
                  if (iVar26 != 0) goto LAB_00111535;
                  puVar62 = ppVar36->base;
                  sVar60 = ppVar36->off;
                  (puVar62 + sVar60)[0] = '\0';
                  (puVar62 + sVar60)[1] = '\0';
                  sVar60 = ppVar36->off;
                  ppVar36->off = sVar60 + 2;
                  ppVar36->base[sVar60] = '\0';
                  ppVar36->base[sVar60 + 1] = '\0';
                }
                ppVar22 = local_60;
                *(undefined8 *)((long)ppVar49 + -8) = 0x1148c6;
                iVar26 = push_additional_extensions(ppVar22,ppVar36);
                if (iVar26 == 0) {
                  lVar41 = ppVar36->off - (long)local_98;
                  *(byte *)((long)&local_88->list[0].identity.base + (long)ppVar36->base) =
                       (byte)((ulong)lVar41 >> 8);
                  *(byte *)((long)&local_88->list[0].identity.base + (long)(ppVar36->base + 1)) =
                       (byte)lVar41;
                  p_Var15 = *(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                              **)local_50->secret;
                  lVar41 = 0x10;
                  do {
                    *(uint8_t *)((long)&local_68->id + *(long *)local_50) =
                         (uint8_t)((ulong)((long)p_Var15 - (long)local_80) >> ((byte)lVar41 & 0x3f))
                    ;
                    lVar41 = lVar41 + -8;
                    local_68 = (ptls_key_exchange_algorithm_t *)((long)&local_68->id + 1);
                  } while (lVar41 != -8);
                  if ((local_58 != (ptls_t *)0x0) &&
                     (local_58->key_schedule != (ptls_key_schedule_t *)0x0)) {
                    lVar41 = *(long *)local_50;
                    pp_Var43 = (_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                                **)local_78->secret;
                    lVar59 = (long)*(_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                                     **)local_50->secret - (long)local_78;
                    puVar62 = (local_58->traffic_protection).dec.secret + 8;
                    ppVar48 = (ptls_key_schedule_t *)0x0;
                    do {
                      puVar63 = *(undefined8 **)puVar62;
                      pcVar11 = (code *)*puVar63;
                      *(undefined8 *)((long)ppVar49 + -8) = 0x11495f;
                      (*pcVar11)(puVar63,(long)pp_Var43 + lVar41 + -0x10,lVar59);
                      ppVar48 = (ptls_key_schedule_t *)((long)&ppVar48->generation + 1);
                      puVar62 = puVar62 + 0x10;
                    } while (ppVar48 != local_58->key_schedule);
                  }
                  ppVar20 = local_40;
                  p_Var14 = local_40->commit_message;
                  *(undefined8 *)((long)ppVar49 + -8) = 0x114977;
                  iVar26 = (*p_Var14)(ppVar20);
                  ppVar20 = local_40;
                  if (iVar26 == 0) {
                    if ((int)local_48 == 0) {
                      if ((_emitter->buf[3].off & 8) != 0) {
                        p_Var14 = local_40->begin_message;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x1149a1;
                        iVar26 = (*p_Var14)(ppVar20);
                        if (iVar26 != 0) goto LAB_00111535;
                        ppVar36 = local_40->buf;
                        local_60 = (ptls_handshake_properties_t *)_emitter[2].buf;
                        local_50 = (ptls_key_schedule_t *)ppVar36->off;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x1149d1;
                        iVar26 = ptls_buffer_reserve(ppVar36,1);
                        if (iVar26 != 0) goto LAB_00111535;
                        ppVar36->base[ppVar36->off] = '\r';
                        ppVar36->off = ppVar36->off + 1;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x1149f5;
                        iVar26 = ptls_buffer_reserve(ppVar36,3);
                        if (iVar26 != 0) goto LAB_00111535;
                        puVar62 = ppVar36->base;
                        sVar60 = ppVar36->off;
                        puVar62[sVar60 + 2] = '\0';
                        puVar62 = puVar62 + sVar60;
                        puVar62[0] = '\0';
                        puVar62[1] = '\0';
                        local_48 = (ptls_key_schedule_t *)ppVar36->off;
                        local_58 = (ptls_t *)((long)&local_48->generation + 3);
                        ppVar36->off = (size_t)local_58;
                        ppVar58 = local_40->buf;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x114a37;
                        iVar26 = ptls_buffer_reserve(ppVar58,1);
                        if (iVar26 != 0) goto LAB_00111535;
                        ppVar58->base[ppVar58->off] = '\0';
                        ppVar58->off = ppVar58->off + 1;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x114a5c;
                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                        if (iVar26 != 0) goto LAB_00111535;
                        puVar62 = ppVar58->base;
                        sVar60 = ppVar58->off;
                        (puVar62 + sVar60)[0] = '\0';
                        (puVar62 + sVar60)[1] = '\0';
                        local_68 = (ptls_key_exchange_algorithm_t *)ppVar58->off;
                        local_78 = (ptls_key_schedule_t *)&local_68->field_0x2;
                        ppVar58->off = (size_t)local_78;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x114a93;
                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                        if (iVar26 != 0) goto LAB_00111535;
                        puVar62 = ppVar58->base;
                        sVar60 = ppVar58->off;
                        (puVar62 + sVar60)[0] = '\0';
                        (puVar62 + sVar60)[1] = '\r';
                        ppVar58->off = ppVar58->off + 2;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x114abb;
                        iVar26 = ptls_buffer_reserve(ppVar58,2);
                        if (iVar26 != 0) goto LAB_00111535;
                        puVar62 = ppVar58->base;
                        sVar60 = ppVar58->off;
                        (puVar62 + sVar60)[0] = '\0';
                        (puVar62 + sVar60)[1] = '\0';
                        local_80 = (ptls_key_schedule_t *)ppVar58->off;
                        pbVar29 = (byte *)((long)&local_80->generation + 2);
                        ppVar58->off = (size_t)pbVar29;
                        vc = (ptls_verify_certificate_t *)_emitter->buf[2].off;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x114af4;
                        iVar26 = push_signature_algorithms(vc,ppVar58);
                        if (iVar26 != 0) goto LAB_00111535;
                        lVar41 = ppVar58->off - (long)pbVar29;
                        *(uint8_t *)((long)local_80->secret + (long)(ppVar58->base + -0x10)) =
                             (uint8_t)((ulong)lVar41 >> 8);
                        *(uint8_t *)((long)local_80->secret + (long)(ppVar58->base + -0xf)) =
                             (uint8_t)lVar41;
                        lVar41 = ppVar58->off - (long)local_78;
                        *(uint8_t *)((long)&local_68->id + (long)ppVar58->base) =
                             (uint8_t)((ulong)lVar41 >> 8);
                        *(uint8_t *)((long)&local_68->id + (long)(ppVar58->base + 1)) =
                             (uint8_t)lVar41;
                        sVar60 = ppVar36->off;
                        lVar41 = 0x10;
                        do {
                          *(uint8_t *)((long)local_48->secret + (long)(ppVar36->base + -0x10)) =
                               (uint8_t)(sVar60 - (long)local_58 >> ((byte)lVar41 & 0x3f));
                          lVar41 = lVar41 + -8;
                          local_48 = (ptls_key_schedule_t *)((long)&local_48->generation + 1);
                        } while (lVar41 != -8);
                        if ((local_60 != (ptls_handshake_properties_t *)0x0) &&
                           ((local_60->field_0).server.cookie.additional_data.base != (uint8_t *)0x0
                           )) {
                          puVar62 = ppVar36->base;
                          pp_Var43 = (_func_int_st_ptls_key_exchange_algorithm_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t_ptr_ptls_iovec_t
                                      **)local_50->secret;
                          lVar41 = ppVar36->off - (long)local_50;
                          puVar63 = (undefined8 *)((long)&local_60->field_0 + 0x60);
                          puVar27 = (uint8_t *)0x0;
                          do {
                            puVar17 = (undefined8 *)*puVar63;
                            pcVar11 = (code *)*puVar17;
                            *(undefined8 *)((long)ppVar49 + -8) = 0x114b98;
                            (*pcVar11)(puVar17,(uint8_t *)((long)pp_Var43 + (long)(puVar62 + -0x10))
                                       ,lVar41);
                            puVar27 = puVar27 + 1;
                            puVar63 = puVar63 + 2;
                          } while (puVar27 != (local_60->field_0).server.cookie.additional_data.base
                                  );
                        }
                        ppVar20 = local_40;
                        p_Var14 = local_40->commit_message;
                        *(undefined8 *)((long)ppVar49 + -8) = 0x114bb0;
                        iVar26 = (*p_Var14)(ppVar20);
                        if (iVar26 != 0) goto LAB_00111535;
                      }
                      ppVar23 = _emitter;
                      ppVar20 = local_40;
                      bVar37 = ch->field_0x4f8;
                      *(size_t *)((long)ppVar49 + -0x10) = (ch->cert_compression_algos).count;
                      *(anon_struct_40_2_1fc0efb2_for_cert_compression_algos **)
                       ((long)ppVar49 + -0x18) = &ch->cert_compression_algos;
                      *(ulong *)((long)ppVar49 + -0x20) = (ulong)(bVar37 & 1);
                      *(undefined8 *)((long)ppVar49 + -0x28) = 0x114bf6;
                      iVar26 = send_certificate_and_certificate_verify
                                         ((ptls_t *)ppVar23,ppVar20,&ch->signature_algorithms,
                                          (ptls_iovec_t)ZEXT816(0),
                                          "TLS 1.3, server CertificateVerify",
                                          *(int *)((long)ppVar49 + -0x20),
                                          *(uint16_t **)((long)ppVar49 + -0x18),
                                          *(size_t *)((long)ppVar49 + -0x10));
                      if (iVar26 != 0) goto LAB_00111535;
                    }
                    ppVar23 = _emitter;
                    ppVar20 = local_40;
                    *(undefined8 *)((long)ppVar49 + -8) = 0x114c0f;
                    iVar26 = send_finished((ptls_t *)ppVar23,ppVar20);
                    if (iVar26 == 0) {
                      ppVar48 = (ptls_key_schedule_t *)_emitter[2].buf;
                      if (ppVar48->generation != 2) {
                        *(undefined8 *)((long)ppVar49 + -8) = 0x114cd9;
                        __assert_fail("tls->key_schedule->generation == 2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                                      ,0x101d,
                                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                     );
                      }
                      *(undefined8 *)((long)ppVar49 + -8) = 0x114c31;
                      iVar26 = key_schedule_extract(ppVar48,(ptls_iovec_t)ZEXT816(0));
                      ppVar20 = _emitter;
                      if (iVar26 == 0) {
                        *(undefined8 *)((long)ppVar49 + -8) = 0x114c56;
                        iVar26 = setup_traffic_protection((ptls_t *)ppVar20,1,"s ap traffic",3,0);
                        if (iVar26 == 0) {
                          ppVar48 = (ptls_key_schedule_t *)_emitter[2].buf;
                          ppVar20 = _emitter + 9;
                          *(undefined8 *)((long)ppVar49 + -8) = 0x114c79;
                          iVar26 = derive_secret(ppVar48,ppVar20,"c ap traffic");
                          ppVar20 = _emitter;
                          if (iVar26 == 0) {
                            *(undefined8 *)((long)ppVar49 + -8) = 0x114c8c;
                            iVar26 = derive_exporter_secret((ptls_t *)ppVar20,0);
                            ppVar20 = _emitter;
                            if (iVar26 == 0) {
                              ppVar36 = _emitter->buf;
                              if (_emitter[0xc].record_header_length == 0) {
                                if ((ppVar36[3].off & 8) == 0) {
                                  *(undefined4 *)&_emitter->enc = 0xd;
                                }
                                else {
                                  *(undefined4 *)&_emitter->enc = 10;
                                }
                              }
                              else if ((ppVar36[3].off & 0x10) == 0) {
                                *(undefined4 *)&_emitter->enc = 0xc;
                              }
                              else {
                                *(undefined8 *)((long)ppVar49 + -8) = 0x114cf4;
                                iVar26 = commission_handshake_secret((ptls_t *)ppVar20);
                                if (iVar26 != 0) goto LAB_00111535;
                                *(undefined4 *)&_emitter->enc = 0xd;
                                ppVar36 = _emitter->buf;
                              }
                              ppVar23 = _emitter;
                              ppVar20 = local_40;
                              if (((ch->psk).ke_modes != 0) && (ppVar36[2].is_allocated != 0)) {
                                *(undefined8 *)((long)ppVar49 + -8) = 0x114d33;
                                iVar26 = send_session_ticket((ptls_t *)ppVar23,ppVar20);
                                if (iVar26 != 0) goto LAB_00111535;
                                ppVar36 = _emitter->buf;
                              }
                              iVar26 = 0x202;
                              if ((ppVar36[3].off & 8) == 0) {
                                iVar26 = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00111535:
  auVar21 = auStack_198;
  ppVar32[-1].hashes[0].ctx = (ptls_hash_context_t *)0x111541;
  free((void *)auVar21);
  puVar62 = ecdh_secret.base;
  auVar21 = auStack_d8;
  if (auStack_d8 != (undefined1  [8])0x0) {
    ppVar32[-1].hashes[0].ctx = (ptls_hash_context_t *)0x11155d;
    (*ptls_clear_memory)((void *)auVar21,(size_t)puVar62);
    auVar21 = auStack_d8;
    ppVar32[-1].hashes[0].ctx = (ptls_hash_context_t *)0x111569;
    free((void *)auVar21);
  }
  ppVar32[-1].hashes[0].ctx = (ptls_hash_context_t *)0x111571;
  free(ch);
  return iVar26;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch->legacy_session_id.base, ch->legacy_session_id.len); });       \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch->selected_version); });                                    \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }